

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx512::forward_int8_x86
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  short sVar3;
  short sVar4;
  _func_int *p_Var5;
  Layer *pLVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [36];
  Option OVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  Option OVar17;
  undefined1 auVar18 [36];
  int n_2;
  int iVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  uint uVar24;
  undefined1 (*pauVar26) [16];
  short asVar27 [4];
  long lVar28;
  short asVar29 [4];
  short asVar30 [4];
  int iVar25;
  short asVar31 [4];
  short asVar32 [4];
  uint uVar33;
  short asVar34 [4];
  ulong uVar35;
  undefined1 *puVar36;
  ulong uVar37;
  void *pvVar38;
  void *pvVar39;
  undefined1 (*pauVar40) [16];
  long lVar41;
  undefined8 *puVar42;
  byte bVar43;
  int j_2;
  short asVar44 [4];
  int tiles;
  long lVar45;
  int iVar46;
  int iVar47;
  ulong uVar48;
  long lVar49;
  short asVar50 [4];
  long lVar51;
  long lVar52;
  int *piVar53;
  int j_1;
  uint uVar54;
  uint uVar55;
  undefined8 *puVar56;
  undefined1 (*pauVar57) [64];
  undefined1 (*pauVar58) [32];
  short asVar59 [4];
  int *piVar60;
  int u_1;
  undefined1 *puVar61;
  ulong uVar62;
  ulong uVar63;
  Allocator *pAVar64;
  size_t sVar65;
  size_t sVar66;
  int i;
  int iVar67;
  long lVar68;
  ulong uVar69;
  short asVar70 [4];
  long lVar71;
  short asVar72 [4];
  short asVar73 [4];
  void *pvVar74;
  int v_1;
  undefined1 *puVar75;
  ulong uVar76;
  short asVar77 [4];
  size_t sVar78;
  void *pvVar79;
  int iVar80;
  long lVar81;
  void *pvVar82;
  int u;
  int iVar83;
  uint uVar84;
  uint uVar85;
  ulong uVar86;
  long lVar87;
  void *pvVar88;
  int i_2;
  int iVar89;
  short asVar90 [4];
  int i_5;
  uint uVar91;
  int iVar92;
  short asVar93 [4];
  undefined1 (*pauVar94) [16];
  short asVar95 [4];
  short asVar96 [4];
  long lVar97;
  long lVar98;
  void *pvVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  void *local_728;
  void *local_718;
  void *local_710;
  void *local_700;
  void *local_6d8;
  undefined8 uStack_6d0;
  int *local_6b8;
  void *local_6a0;
  Mat local_698;
  void *local_648;
  short local_640 [4];
  short local_638 [4];
  short local_630 [4];
  Mat local_628;
  short d0 [4];
  Mat local_588;
  short local_538 [4];
  ulong local_530;
  short t3 [4];
  short t2 [4];
  short t1 [4];
  short t0 [4];
  short d1 [4];
  int *piStack_500;
  size_t sStack_4f8;
  Allocator *pAStack_4e8;
  int iStack_4dc;
  int iStack_4d8;
  undefined1 auStack_4ec [36];
  Option opt_b;
  size_t local_478;
  void *local_468;
  void *local_448;
  short w3 [4];
  short local_430 [2];
  short local_42c [2];
  short w2 [4];
  short local_420 [2];
  short local_41c [2];
  undefined1 auStack_418 [8];
  short local_410 [4];
  short local_408 [4];
  ulong local_400;
  short local_3f8 [4];
  undefined8 local_3f0;
  int aiStack_3e8 [4];
  Option opt_q;
  int aiStack_390 [2];
  undefined1 local_388 [16];
  undefined1 auStack_378 [80];
  undefined1 local_328 [16];
  undefined1 auStack_318 [80];
  undefined1 local_2c8 [16];
  undefined1 auStack_2b8 [80];
  undefined1 local_268 [16];
  undefined1 auStack_258 [96];
  undefined1 auStack_1f8 [96];
  short w1 [4];
  ulong local_158;
  int o0 [2];
  Mat local_148;
  short w0 [4];
  short d3 [4];
  short d2 [4];
  
  local_148.elempack = bottom_blob->elempack;
  local_148.elemsize = bottom_blob->elemsize;
  piVar60 = bottom_blob->refcount;
  local_148.data = bottom_blob->data;
  local_148.refcount = bottom_blob->refcount;
  local_148.allocator = bottom_blob->allocator;
  local_148.dims = bottom_blob->dims;
  local_148.w = bottom_blob->w;
  local_148.h = bottom_blob->h;
  local_148.d = bottom_blob->d;
  local_148.c = bottom_blob->c;
  local_148.cstep = bottom_blob->cstep;
  if (piVar60 != (int *)0x0) {
    LOCK();
    *piVar60 = *piVar60 + 1;
    UNLOCK();
  }
  if (local_148.elempack == 0 || ((int)local_148.elemsize * 8) / local_148.elempack != 8) {
    auVar109 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar109 = vmovdqu64_avx512f(auVar109);
    opt_q._16_48_ = auVar109._16_48_;
    opt_q._0_8_ = auVar109._0_8_;
    opt_q.blob_allocator = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_148,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86_avx512[-3]),
                     &opt_q);
  }
  local_698.cstep = 0;
  local_698.data = (void *)0x0;
  local_698.refcount._0_4_ = 0;
  local_698.refcount._4_4_ = 0;
  local_698.elemsize = 0;
  local_698.elempack = 0;
  local_698.allocator = (Allocator *)0x0;
  local_698.dims = 0;
  local_698.w = 0;
  local_698.h = 0;
  local_698.d = 0;
  local_698.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86_avx512 +
             (long)this->_vptr_Convolution_x86_avx512[-3]),&local_148,&local_698,opt);
  iVar47 = local_698.elempack;
  iVar67 = -100;
  if ((local_698.data == (void *)0x0) || (local_698.cstep * (long)local_698.c == 0))
  goto LAB_001ccc42;
  p_Var5 = this->_vptr_Convolution_x86_avx512[-3];
  uVar55 = *(uint *)(p_Var5 + 0x28 + (long)&(this->weight_winograd23_data).data);
  iVar83 = (~((*(int *)(p_Var5 + 0x2c + (long)&(this->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data)) + local_698.w) /
           *(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) + 1;
  iVar80 = (~((*(int *)(p_Var5 + 0x30 + (long)&(this->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data)) + local_698.h) /
           *(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) + 1;
  iVar19 = *(int *)(p_Var5 + 0x18 + (long)&(this->weight_winograd43_data).data);
  if (opt->use_packing_layout == true) {
    if (iVar19 < 0x65) {
      uVar54 = (uint)((uVar55 & 3) == 0) * 3 + 1;
    }
    else {
      uVar54 = 1;
      if ((uVar55 & 7) == 0) {
        uVar54 = 8;
      }
    }
  }
  else {
    uVar54 = 1;
  }
  uVar91 = uVar54 * 4;
  if (100 < iVar19) {
    uVar91 = uVar54;
  }
  local_630 = (short  [4])(long)local_698.c;
  Mat::create(top_blob,iVar83,iVar80,(int)uVar55 / (int)uVar54,(ulong)uVar91,uVar54,
              opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_001ccc42;
  if (opt->use_packing_layout == true) {
    local_640._0_4_ =
         (uint)(((byte)(this->_vptr_Convolution_x86_avx512[-3] + 0x28)
                       [(long)&(this->weight_winograd23_data).data] & 3) == 0) * 3 + 1;
    local_640[2] = 0;
    local_640[3] = 0;
  }
  else {
    local_640[0] = 1;
    local_640[1] = 0;
    local_640[2] = 0;
    local_640[3] = 0;
  }
  local_628.cstep = 0;
  local_628.data = (void *)0x0;
  local_628.refcount._0_4_ = 0;
  local_628.refcount._4_4_ = 0;
  local_628.elemsize = 0;
  local_628.elempack = 0;
  local_628.allocator = (Allocator *)0x0;
  local_628.dims = 0;
  local_628.w = 0;
  local_628.h = 0;
  local_628.d = 0;
  local_628.c = 0;
  iVar67 = local_640._0_4_;
  local_3f0 = top_blob;
  aiStack_3e8[3] = iVar19;
  Mat::create(&local_628,iVar83,iVar80,
              *(int *)(this->_vptr_Convolution_x86_avx512[-3] + 0x28 +
                      (long)&(this->weight_winograd23_data).data) / iVar67,(ulong)(uint)(iVar67 * 4)
              ,iVar67,opt->workspace_allocator);
  auVar109 = _d1;
  iVar83 = local_628.c;
  uVar91 = local_628.h;
  uVar54 = local_628.w;
  uVar55 = local_698.c;
  iVar80 = local_698.w;
  iVar19 = local_698.elempack;
  iVar67 = -100;
  if ((local_628.data != (void *)0x0) && (local_628.cstep * (long)local_628.c != 0)) {
    if ((iVar47 != 8) || (local_640._0_4_ != 4)) goto LAB_001ca52d;
    p_Var5 = this->_vptr_Convolution_x86_avx512[-3];
    uVar33 = *(uint *)(p_Var5 + 0x2c + (long)&(this->weight_winograd23_data).data);
    uVar20 = (ulong)uVar33;
    uVar15 = opt_q._60_4_;
    if ((uVar33 == 1) && (*(int *)(p_Var5 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)
       ) {
      if ((*(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1) ||
         (((*(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1 ||
           (*(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1)) ||
          (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)))) {
        if (((*(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1) ||
            (*(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
           ((*(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2 ||
            (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))))
        goto LAB_001c9a87;
        opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
        opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
        opt_q = (Option)CONCAT460(uVar15,opt_q._0_60_);
        Mat::create((Mat *)&opt_q,local_628.w,local_628.h,local_698.c,local_698.elemsize,
                    local_698.elempack,opt->workspace_allocator);
        uVar48 = 0;
        uVar20 = (ulong)uVar54;
        if ((int)uVar54 < 1) {
          uVar20 = uVar48;
        }
        uVar22 = (ulong)uVar91;
        if ((int)uVar91 < 1) {
          uVar22 = uVar48;
        }
        uVar63 = (ulong)uVar55;
        if ((int)uVar55 < 1) {
          uVar63 = uVar48;
        }
        for (; uVar48 != uVar63; uVar48 = uVar48 + 1) {
          puVar56 = (undefined8 *)
                    (local_698.cstep * uVar48 * local_698.elemsize + (long)local_698.data);
          puVar42 = (undefined8 *)opt_q._0_8_;
          for (iVar67 = 0; uVar86 = uVar20, iVar67 != (int)uVar22; iVar67 = iVar67 + 1) {
            while (iVar19 = (int)uVar86, uVar86 = (ulong)(iVar19 - 1), iVar19 != 0) {
              *puVar42 = *puVar56;
              puVar56 = puVar56 + 2;
              puVar42 = puVar42 + 1;
            }
            puVar56 = puVar56 + (int)((iVar80 - uVar54) * 2);
          }
        }
        conv1x1s1_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
        if (opt_q.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
            pvVar38 = (void *)opt_q._0_8_;
            if (opt_q._32_8_ == 0) goto LAB_001ce959;
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
        goto LAB_001ca52d;
      }
      conv1x1s1_sgemm_pack8to4_int8_sse(&local_698,&local_628,&this->weight_sgemm_data,opt);
    }
    else {
LAB_001c9a87:
      if ((((opt->use_winograd_convolution == true) && (uVar33 == 3)) &&
          (opt->use_winograd43_convolution != false)) &&
         ((((*(int *)(p_Var5 + 0x30 + (long)&(this->weight_winograd23_data).data) == 3 &&
            (*(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1)) &&
           (*(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          ((*(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))))) {
        auVar102._4_4_ = local_628.h;
        auVar102._0_4_ = local_628.w;
        piVar60 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
        local_588.data = local_698.data;
        local_588.refcount._0_4_ = local_698.refcount._0_4_;
        local_588.refcount._4_4_ = local_698.refcount._4_4_;
        local_588.elemsize = local_698.elemsize;
        local_588.elempack = local_698.elempack;
        local_588.allocator = local_698.allocator;
        local_588.d = local_698.d;
        local_588.h = local_698.h;
        local_588.dims = local_698.dims;
        local_588.w = local_698.w;
        local_588.c = local_698.c;
        local_588.cstep = local_698.cstep;
        if (piVar60 != (int *)0x0) {
          LOCK();
          *piVar60 = *piVar60 + 1;
          UNLOCK();
        }
        auVar101._8_4_ = 3;
        auVar101._0_8_ = 0x300000003;
        auVar101._12_4_ = 3;
        auVar102._8_8_ = 0;
        auVar102 = vpaddd_avx512vl(auVar102,auVar101);
        auVar116 = vpsrad_avx(auVar102,0x1f);
        auVar116 = vpsrld_avx(auVar116,0x1e);
        auVar102 = vpaddd_avx(auVar102,auVar116);
        auVar133._8_4_ = 0xfffffffc;
        auVar133._0_8_ = 0xfffffffcfffffffc;
        auVar133._12_4_ = 0xfffffffc;
        auVar116 = vpandd_avx512vl(auVar102,auVar133);
        iVar25 = auVar116._0_4_ + 2;
        copy_make_border(&local_698,&local_588,0,(auVar116._4_4_ + 2) - local_698.h,0,
                         iVar25 - local_698.w,0,0.0,opt);
        auVar101 = vpsrad_avx512vl(auVar102,2);
        iVar67 = auVar101._0_4_;
        local_638[0] = (short)iVar67;
        local_638[1] = (short)((uint)iVar67 >> 0x10);
        iVar67 = iVar67 * 6;
        uVar91 = auVar101._4_4_;
        iVar80 = iVar67 * uVar91;
        local_648 = (void *)(ulong)(uint)(iVar19 * 2);
        d0[0] = 0;
        d0[1] = 0;
        d0[2] = 0;
        d0[3] = 0;
        uVar54 = (uint)((long)iVar80 / 6);
        local_530 = (ulong)auVar116._0_4_;
        Mat::create((Mat *)d0,uVar54,0x24,uVar55,(size_t)local_648,iVar19,opt->workspace_allocator);
        lVar68 = (long)(int)(uVar54 * 8);
        lVar51 = (long)(int)(uVar54 << 4);
        uVar48 = 0;
        uVar20 = 0;
        if (0 < (int)local_638._0_4_) {
          uVar20 = (ulong)local_638 & 0xffffffff;
        }
        uStack_6d0 = auVar102._8_8_;
        local_6d8 = (void *)uVar20;
        uVar22 = (ulong)uVar91;
        if ((int)uVar91 < 1) {
          uVar22 = uVar48;
        }
        uVar63 = 0;
        if (0 < (int)uVar55) {
          uVar63 = (ulong)uVar55;
        }
        auVar117._8_2_ = 0xfffb;
        auVar117._0_8_ = 0xfffbfffbfffbfffb;
        auVar117._10_2_ = 0xfffb;
        auVar117._12_2_ = 0xfffb;
        auVar117._14_2_ = 0xfffb;
        for (; uVar48 != uVar63; uVar48 = uVar48 + 1) {
          pauVar94 = (undefined1 (*) [16])
                     ((long)local_588.data + local_588.cstep * local_588.elemsize * uVar48 + 0x20);
          for (uVar86 = 0; uVar86 != uVar22; uVar86 = uVar86 + 1) {
            pauVar21 = (undefined1 (*) [16])((long)((iVar67 * (int)uVar86) / 6) * 0x10 + (long)d0);
            pauVar40 = pauVar94;
            for (uVar35 = 0; pauVar23 = pauVar40, lVar28 = -0x60, uVar35 != uVar20;
                uVar35 = uVar35 + 1) {
              for (; lVar49 = 0x50, pauVar26 = pauVar21, lVar28 != 0; lVar28 = lVar28 + 0x10) {
                auVar102 = pauVar23[-2];
                auVar101 = pauVar23[-1];
                auVar133 = *pauVar23;
                auVar103 = vpcmpgtb_avx((undefined1  [16])0x0,auVar102);
                auVar100 = vpcmpgtb_avx((undefined1  [16])0x0,auVar101);
                auVar129 = vpcmpgtb_avx((undefined1  [16])0x0,auVar133);
                auVar134 = vpunpcklbw_avx(auVar102,auVar103);
                auVar132 = vpunpckhbw_avx(auVar102,auVar103);
                auVar103 = vpunpcklbw_avx(auVar101,auVar100);
                auVar100 = vpunpckhbw_avx(auVar101,auVar100);
                auVar114 = vpunpcklbw_avx(auVar133,auVar129);
                auVar124 = vpunpckhbw_avx(auVar133,auVar129);
                auVar102 = vpsllw_avx(auVar134,2);
                auVar102 = vpaddw_avx(auVar102,auVar114);
                auVar101 = vpmullw_avx(auVar103,auVar117);
                auVar102 = vpaddw_avx(auVar102,auVar101);
                auVar101 = vpaddw_avx(auVar114,auVar100);
                auVar133 = vpaddw_avx(auVar103,auVar132);
                auVar133 = vpsllw_avx(auVar133,2);
                auVar129 = vpsubw_avx(auVar101,auVar133);
                auVar101 = vpsubw_avx(auVar114,auVar100);
                auVar133 = vpsubw_avx(auVar132,auVar103);
                auVar133 = vpsllw_avx(auVar133,2);
                auVar101 = vpaddw_avx(auVar101,auVar133);
                auVar103 = vpsubw_avx(auVar114,auVar103);
                auVar133 = vpsubw_avx(auVar132,auVar100);
                auVar133 = vpaddw_avx(auVar133,auVar133);
                auVar134 = vpsubw_avx(auVar103,auVar133);
                auVar133 = vpaddw_avx(auVar103,auVar133);
                auVar103 = vpsllw_avx(auVar132,2);
                auVar103 = vpaddw_avx(auVar103,auVar124);
                auVar100 = vpmullw_avx(auVar100,auVar117);
                auVar103 = vpaddw_avx(auVar103,auVar100);
                *(undefined1 (*) [16])(auStack_378 + lVar28) = auVar102;
                *(undefined1 (*) [16])(auStack_318 + lVar28) = auVar129;
                *(undefined1 (*) [16])(auStack_2b8 + lVar28) = auVar101;
                *(undefined1 (*) [16])(auStack_258 + lVar28) = auVar134;
                *(undefined1 (*) [16])(auStack_1f8 + lVar28) = auVar133;
                *(undefined1 (*) [16])((long)w1 + lVar28) = auVar103;
                pauVar23 = (undefined1 (*) [16])(*pauVar23 + iVar25 * 8);
              }
              for (; lVar49 != 0x290; lVar49 = lVar49 + 0x60) {
                auVar102 = *(undefined1 (*) [16])(auStack_418 + lVar49);
                auVar101 = *(undefined1 (*) [16])((long)local_408 + lVar49);
                auVar133 = *(undefined1 (*) [16])((long)local_3f8 + lVar49);
                auVar103 = *(undefined1 (*) [16])((long)aiStack_3e8 + lVar49);
                auVar100 = vpsllw_avx512vl(*(undefined1 (*) [16])((long)w2 + lVar49),2);
                auVar129 = vpmullw_avx(auVar101,auVar117);
                auVar100 = vpaddw_avx(auVar100,auVar103);
                auVar100 = vpaddw_avx(auVar129,auVar100);
                auVar129 = vpaddw_avx(auVar103,auVar133);
                auVar134 = vpaddw_avx(auVar101,auVar102);
                auVar134 = vpsllw_avx(auVar134,2);
                auVar134 = vpsubw_avx(auVar129,auVar134);
                auVar129 = vpsubw_avx(auVar103,auVar133);
                auVar132 = vpsubw_avx(auVar102,auVar101);
                auVar132 = vpsllw_avx(auVar132,2);
                auVar129 = vpaddw_avx(auVar132,auVar129);
                auVar103 = vpsubw_avx(auVar103,auVar101);
                auVar101 = vpsubw_avx(auVar102,auVar133);
                auVar101 = vpaddw_avx(auVar101,auVar101);
                auVar132 = vpsubw_avx(auVar103,auVar101);
                auVar101 = vpaddw_avx(auVar103,auVar101);
                auVar103 = vpsllw_avx(auVar102,2);
                auVar102 = vpmullw_avx(auVar133,auVar117);
                auVar102 = vpaddw_avx(auVar102,auVar103);
                auVar102 = vpaddw_avx(auVar102,*(undefined1 (*) [16])(&opt_q.lightmode + lVar49));
                *pauVar26 = auVar100;
                *(undefined1 (*) [16])(*pauVar26 + lVar68 * 2) = auVar134;
                *(undefined1 (*) [16])(*pauVar26 + lVar51 * 2) = auVar129;
                *(undefined1 (*) [16])(*pauVar26 + (long)(int)(uVar54 * 0x18) * 2) = auVar132;
                *(undefined1 (*) [16])(*pauVar26 + (long)(int)(uVar54 << 5) * 2) = auVar101;
                *(undefined1 (*) [16])(*pauVar26 + (long)(int)(uVar54 * 0x28) * 2) = auVar102;
                pauVar26 = (undefined1 (*) [16])(*pauVar26 + (long)(int)(uVar54 * 0x30) * 2);
              }
              pauVar40 = pauVar40 + 2;
              pauVar21 = pauVar21 + 1;
            }
            pauVar94 = (undefined1 (*) [16])(*pauVar94 + (long)local_588.w * local_588.elemsize * 4)
            ;
          }
        }
        piVar60 = (int *)CONCAT44(local_588.refcount._4_4_,local_588.refcount._0_4_);
        if (piVar60 != (int *)0x0) {
          LOCK();
          *piVar60 = *piVar60 + -1;
          UNLOCK();
          if (*piVar60 == 0) {
            if (local_588.allocator == (Allocator *)0x0) {
              free(local_588.data);
            }
            else {
              (*(local_588.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        auVar13 = (undefined1  [36])opt_q._28_36_;
        local_588.cstep = 0;
        local_588.data = (void *)0x0;
        local_588.refcount._0_4_ = 0;
        local_588.refcount._4_4_ = 0;
        local_588.elemsize = 0;
        local_588.elempack = 0;
        local_588.h = 0;
        local_588.d = 0;
        local_588.c = 0;
        local_588.allocator = (Allocator *)0x0;
        local_588.dims = 0;
        local_588.w = 0;
        _d1 = SUB1612((undefined1  [16])0x0,0);
        _d1 = ZEXT1228(_d1);
        auStack_4ec._32_4_ = auVar109._60_4_;
        _d1 = ZEXT3260(_d1);
        opt_q._0_12_ = SUB1612((undefined1  [16])0x0,0);
        opt_q._0_28_ = ZEXT1228((undefined1  [12])opt_q._0_12_);
        opt_q._60_4_ = auVar13._32_4_;
        opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
        if (iVar80 < 0x18) {
          uVar91 = uVar54;
          if (0xb < iVar80) {
            uVar55 = uVar55 * 2;
            uVar91 = (uVar54 & 1) + 1;
          }
        }
        else {
          uVar55 = uVar55 << 2;
          uVar91 = (uVar54 & 1) + (int)(((long)iVar80 / 6 & 0xffffffffU) >> 2) +
                   (uint)((uVar54 >> 1 & 1) != 0);
        }
        Mat::create((Mat *)&opt_q,uVar55,uVar91,0x24,(size_t)local_648,iVar19,
                    opt->workspace_allocator);
        lVar28 = (long)(int)uVar54;
        for (lVar49 = 0; lVar49 != 0x24; lVar49 = lVar49 + 1) {
          lVar71 = (long)(int)opt_q._44_4_ * (long)opt_q.workspace_allocator;
          lVar98 = lVar49 * lVar28;
          for (uVar48 = 0; (long)(uVar48 | 3) < lVar28; uVar48 = uVar48 + 4) {
            pauVar57 = (undefined1 (*) [64])((uVar48 >> 2) * lVar71 + opt_q._0_8_);
            uVar86 = uVar63;
            while (iVar19 = (int)uVar86, uVar86 = (ulong)(iVar19 - 1), iVar19 != 0) {
              auVar109 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((uVar48 + lVar98) * 0x10 + (long)d0));
              auVar109 = vmovdqu64_avx512f(auVar109);
              *pauVar57 = auVar109;
              pauVar57 = pauVar57 + 1;
            }
          }
          for (; (long)(uVar48 | 1) < lVar28; uVar48 = uVar48 + 2) {
            pauVar58 = (undefined1 (*) [32])
                       ((ulong)(((uint)(uVar48 >> 2) & 0x3fffffff) +
                               (uint)(((uint)uVar48 >> 1 & 1) != 0)) * lVar71 + opt_q._0_8_);
            uVar86 = uVar63;
            while (iVar19 = (int)uVar86, uVar86 = (ulong)(iVar19 - 1), iVar19 != 0) {
              *pauVar58 = *(undefined1 (*) [32])((uVar48 + lVar98) * 0x10 + (long)d0);
              pauVar58 = pauVar58 + 1;
            }
          }
          for (; (long)uVar48 < lVar28; uVar48 = uVar48 + 1) {
            pauVar94 = (undefined1 (*) [16])
                       ((ulong)(((uint)uVar48 & 1) + ((uint)(uVar48 >> 2) & 0x3fffffff) +
                               (uint)(((uint)uVar48 >> 1 & 1) != 0)) * lVar71 + opt_q._0_8_);
            uVar86 = uVar63;
            while (iVar19 = (int)uVar86, uVar86 = (ulong)(iVar19 - 1), iVar19 != 0) {
              *pauVar94 = *(undefined1 (*) [16])((uVar48 + lVar98) * 0x10 + (long)d0);
              pauVar94 = pauVar94 + 1;
            }
          }
        }
        d0[0] = 0;
        d0[1] = 0;
        d0[2] = 0;
        d0[3] = 0;
        Mat::create((Mat *)d1,uVar54,0x24,iVar83,0x10,4,opt->workspace_allocator);
        uVar86 = 0;
        uVar48 = 0;
        if (0 < iVar83) {
          uVar48 = (ulong)(uint)iVar83;
        }
        auVar119 = vpmovsxbd_avx2(ZEXT816(0xe0b06030f0a0702));
        auVar122 = vpmovsxbd_avx2(ZEXT816(0xc0904010d080500));
        for (; uVar86 != uVar48; uVar86 = uVar86 + 1) {
          iVar19 = (this->weight_winograd43_data).w;
          sVar78 = (this->weight_winograd43_data).elemsize;
          pvVar38 = (void *)(sVar78 * (this->weight_winograd43_data).cstep * uVar86 +
                            (long)(this->weight_winograd43_data).data);
          asVar93 = d1;
          for (lVar49 = 0; lVar49 != 0x24; lVar49 = lVar49 + 1) {
            lVar98 = (long)(int)opt_q._44_4_;
            lVar71 = opt_q._0_8_;
            for (uVar35 = 0; (long)(uVar35 | 3) < lVar28; uVar35 = uVar35 + 4) {
              auVar109 = ZEXT1664((undefined1  [16])0x0);
              lVar81 = 0;
              auVar120 = ZEXT1664((undefined1  [16])0x0);
              auVar123 = ZEXT1664((undefined1  [16])0x0);
              auVar125 = ZEXT1664((undefined1  [16])0x0);
              auVar126 = ZEXT1664((undefined1  [16])0x0);
              auVar127 = ZEXT1664((undefined1  [16])0x0);
              auVar128 = ZEXT1664((undefined1  [16])0x0);
              auVar131 = ZEXT1664((undefined1  [16])0x0);
              uVar69 = uVar63;
              while( true ) {
                iVar80 = (int)uVar69;
                uVar69 = (ulong)(iVar80 - 1);
                auVar135 = auVar128._0_32_;
                auVar136 = auVar131._0_32_;
                auVar106 = auVar126._0_32_;
                auVar130 = auVar127._0_32_;
                auVar107 = auVar123._0_32_;
                auVar108 = auVar125._0_32_;
                auVar104 = auVar109._0_32_;
                auVar105 = auVar120._0_32_;
                if (iVar80 == 0) break;
                auVar1 = *(undefined1 (*) [32])((long)pvVar38 + lVar81);
                auVar2 = *(undefined1 (*) [32])((long)pvVar38 + lVar81 + 0x20);
                auVar8 = *(undefined1 (*) [32])(lVar71 + lVar81);
                auVar10 = *(undefined1 (*) [32])(lVar71 + 0x20 + lVar81);
                auVar9 = vpermq_avx2(auVar8,0x4e);
                auVar7 = vpmaddwd_avx2(auVar8,auVar1);
                auVar136 = vpaddd_avx2(auVar7,auVar136);
                auVar131 = ZEXT3264(auVar136);
                auVar136 = vpmaddwd_avx2(auVar9,auVar1);
                auVar135 = vpaddd_avx2(auVar136,auVar135);
                auVar128 = ZEXT3264(auVar135);
                auVar135 = vpmaddwd_avx2(auVar8,auVar2);
                auVar130 = vpaddd_avx2(auVar135,auVar130);
                auVar127 = ZEXT3264(auVar130);
                auVar130 = vpmaddwd_avx2(auVar9,auVar2);
                auVar106 = vpaddd_avx2(auVar130,auVar106);
                auVar126 = ZEXT3264(auVar106);
                auVar130 = vpermq_avx2(auVar10,0x4e);
                auVar106 = vpmaddwd_avx2(auVar10,auVar1);
                auVar108 = vpaddd_avx2(auVar106,auVar108);
                auVar125 = ZEXT3264(auVar108);
                auVar108 = vpmaddwd_avx2(auVar130,auVar1);
                auVar107 = vpaddd_avx2(auVar108,auVar107);
                auVar123 = ZEXT3264(auVar107);
                auVar107 = vpmaddwd_avx2(auVar10,auVar2);
                auVar105 = vpaddd_avx2(auVar107,auVar105);
                auVar120 = ZEXT3264(auVar105);
                auVar105 = vpmaddwd_avx2(auVar130,auVar2);
                auVar104 = vpaddd_avx2(auVar105,auVar104);
                auVar109 = ZEXT3264(auVar104);
                lVar81 = lVar81 + 0x40;
              }
              auVar1 = vpunpckldq_avx2(auVar136,auVar135);
              auVar2 = vpunpckldq_avx2(auVar130,auVar106);
              auVar135 = vpunpckhdq_avx2(auVar136,auVar135);
              auVar106 = vpunpckhdq_avx2(auVar130,auVar106);
              auVar130 = vpunpckldq_avx2(auVar108,auVar107);
              auVar136 = vpunpckldq_avx2(auVar105,auVar104);
              auVar107 = vpunpckhdq_avx2(auVar108,auVar107);
              auVar108 = vpunpckhdq_avx2(auVar105,auVar104);
              auVar104 = vpermt2d_avx512vl(auVar1,auVar119,auVar2);
              auVar105 = vpermt2d_avx512vl(auVar1,auVar122,auVar2);
              auVar104 = vpaddd_avx2(auVar105,auVar104);
              auVar105 = vpermt2d_avx512vl(auVar135,auVar119,auVar106);
              auVar106 = vpermt2d_avx512vl(auVar135,auVar122,auVar106);
              auVar105 = vpaddd_avx2(auVar106,auVar105);
              auVar104 = vpaddd_avx2(auVar104,auVar105);
              auVar105 = vpermt2d_avx512vl(auVar130,auVar119,auVar136);
              auVar106 = vpermt2d_avx512vl(auVar130,auVar122,auVar136);
              auVar105 = vpaddd_avx2(auVar106,auVar105);
              auVar106 = vpermt2d_avx512vl(auVar107,auVar119,auVar108);
              auVar107 = vpermt2d_avx512vl(auVar107,auVar122,auVar108);
              auVar107 = vpaddd_avx2(auVar106,auVar107);
              auVar105 = vpaddd_avx2(auVar105,auVar107);
              *(undefined1 (*) [32])asVar93 = auVar104;
              *(undefined1 (*) [32])((long)asVar93 + 0x20) = auVar105;
              asVar93 = (short  [4])((long)asVar93 + 0x40);
              lVar71 = lVar71 + (long)opt_q.workspace_allocator * lVar98;
            }
            uVar55 = 0;
            for (; (int)((uint)uVar35 | 1) < (int)uVar54; uVar35 = (ulong)((uint)uVar35 + 2)) {
              auVar109 = ZEXT1664((undefined1  [16])0x0);
              lVar71 = 0;
              auVar120 = ZEXT1664((undefined1  [16])0x0);
              auVar123 = ZEXT1664((undefined1  [16])0x0);
              auVar125 = ZEXT1664((undefined1  [16])0x0);
              uVar69 = uVar63;
              while( true ) {
                iVar80 = (int)uVar69;
                uVar69 = (ulong)(iVar80 - 1);
                auVar107 = auVar123._0_32_;
                auVar108 = auVar125._0_32_;
                auVar104 = auVar109._0_32_;
                auVar105 = auVar120._0_32_;
                if (iVar80 == 0) break;
                auVar106 = *(undefined1 (*) [32])
                            ((ulong)((uVar55 & 1) + ((uint)(uVar35 >> 2) & 0x3fffffff)) * lVar98 *
                             (long)opt_q.workspace_allocator + opt_q._0_8_ + lVar71);
                auVar130 = *(undefined1 (*) [32])((long)pvVar38 + lVar71 * 2);
                auVar135 = *(undefined1 (*) [32])((long)pvVar38 + lVar71 * 2 + 0x20);
                auVar1 = vpermq_avx2(auVar106,0x4e);
                auVar136 = vpmaddwd_avx2(auVar106,auVar130);
                auVar108 = vpaddd_avx2(auVar136,auVar108);
                auVar125 = ZEXT3264(auVar108);
                auVar108 = vpmaddwd_avx2(auVar1,auVar130);
                auVar107 = vpaddd_avx2(auVar108,auVar107);
                auVar123 = ZEXT3264(auVar107);
                auVar107 = vpmaddwd_avx2(auVar135,auVar106);
                auVar105 = vpaddd_avx2(auVar107,auVar105);
                auVar120 = ZEXT3264(auVar105);
                auVar105 = vpmaddwd_avx2(auVar1,auVar135);
                auVar104 = vpaddd_avx2(auVar105,auVar104);
                auVar109 = ZEXT3264(auVar104);
                lVar71 = lVar71 + 0x20;
              }
              auVar106 = vpunpckldq_avx2(auVar108,auVar107);
              auVar130 = vpunpckldq_avx2(auVar105,auVar104);
              auVar107 = vpunpckhdq_avx2(auVar108,auVar107);
              auVar105 = vpunpckhdq_avx2(auVar105,auVar104);
              auVar104 = vpermt2d_avx512vl(auVar106,auVar119,auVar130);
              auVar108 = vpermt2d_avx512vl(auVar106,auVar122,auVar130);
              auVar104 = vpaddd_avx2(auVar108,auVar104);
              auVar108 = vpermt2d_avx512vl(auVar107,auVar119,auVar105);
              auVar105 = vpermt2d_avx512vl(auVar107,auVar122,auVar105);
              auVar105 = vpaddd_avx2(auVar108,auVar105);
              auVar104 = vpaddd_avx2(auVar104,auVar105);
              *(undefined1 (*) [32])asVar93 = auVar104;
              asVar93 = (short  [4])((long)asVar93 + 0x20);
              uVar55 = (uint)(byte)((char)uVar55 + 1);
            }
            while( true ) {
              uVar55 = (uint)uVar35;
              if ((int)uVar54 <= (int)uVar55) break;
              auVar109 = ZEXT1664((undefined1  [16])0x0);
              lVar71 = 0;
              auVar120 = ZEXT1664((undefined1  [16])0x0);
              uVar69 = uVar63;
              while (iVar80 = (int)uVar69, uVar69 = (ulong)(iVar80 - 1), iVar80 != 0) {
                auVar102 = *(undefined1 (*) [16])
                            ((ulong)((uVar55 & 1) + ((uint)(uVar35 >> 2) & 0x3fffffff) +
                                    (uint)((uVar55 >> 1 & 1) != 0)) * lVar98 *
                             (long)opt_q.workspace_allocator + opt_q._0_8_ + lVar71);
                auVar105._16_16_ = auVar102;
                auVar105._0_16_ = auVar102;
                auVar104 = vpmaddwd_avx2(auVar105,*(undefined1 (*) [32])((long)pvVar38 + lVar71 * 4)
                                        );
                auVar104 = vpaddd_avx2(auVar104,auVar120._0_32_);
                auVar120 = ZEXT3264(auVar104);
                auVar104 = vpmaddwd_avx2(auVar105,*(undefined1 (*) [32])
                                                   ((long)pvVar38 + lVar71 * 4 + 0x20));
                auVar104 = vpaddd_avx2(auVar104,auVar109._0_32_);
                auVar109 = ZEXT3264(auVar104);
                lVar71 = lVar71 + 0x10;
              }
              auVar102 = vpunpckldq_avx(auVar120._0_16_,auVar120._16_16_);
              auVar117 = vpunpckldq_avx(auVar109._0_16_,auVar109._16_16_);
              auVar101 = vpunpckhdq_avx(auVar120._0_16_,auVar120._16_16_);
              auVar133 = vpunpckhdq_avx(auVar109._0_16_,auVar109._16_16_);
              auVar103 = vpunpcklqdq_avx(auVar102,auVar117);
              auVar102 = vpunpckhqdq_avx(auVar102,auVar117);
              auVar102 = vpaddd_avx(auVar103,auVar102);
              auVar117 = vpunpcklqdq_avx(auVar101,auVar133);
              auVar101 = vpunpckhqdq_avx(auVar101,auVar133);
              auVar101 = vpaddd_avx(auVar101,auVar117);
              auVar102 = vpaddd_avx(auVar102,auVar101);
              *(undefined1 (*) [16])asVar93 = auVar102;
              asVar93 = (short  [4])((long)asVar93 + 0x10);
              uVar35 = (ulong)(uVar55 + 1);
            }
            pvVar38 = (void *)((long)pvVar38 + (long)iVar19 * sVar78);
          }
        }
        if (opt_q.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
            if (opt_q._32_8_ == 0) {
              free((void *)opt_q._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        auVar13 = (undefined1  [36])opt_b._28_36_;
        d0[0] = 0;
        d0[1] = 0;
        d0[2] = 0;
        d0[3] = 0;
        local_478 = 0;
        opt_b._0_12_ = SUB1612((undefined1  [16])0x0,0);
        opt_b._0_28_ = ZEXT1228((undefined1  [12])opt_b._0_12_);
        opt_b._60_4_ = auVar13._32_4_;
        uVar15 = opt_b._60_4_;
        opt_b._0_60_ = ZEXT3260((undefined1  [32])opt_b._0_32_);
        OVar14 = opt_b;
        auVar103._4_4_ = local_628.h;
        auVar103._0_4_ = local_628.w;
        auVar103._8_8_ = 0;
        uVar63 = vpcmpd_avx512vl(auVar103,auVar116,4);
        if ((uVar63 & 3) == 0) {
          piVar60 = (int *)CONCAT44(local_628.refcount._4_4_,local_628.refcount._0_4_);
          if (piVar60 != (int *)0x0) {
            LOCK();
            *piVar60 = *piVar60 + 1;
            UNLOCK();
          }
          opt_b.blob_allocator._4_4_ = local_628.refcount._4_4_;
          opt_b.blob_allocator._0_4_ = local_628.refcount._0_4_;
          opt_b._0_8_ = local_628.data;
          opt_b.workspace_allocator = (Allocator *)local_628.elemsize;
          opt_b._28_36_ = OVar14._28_36_;
          opt_b.openmp_blocktime = local_628.elempack;
          opt_b._32_8_ = local_628.allocator;
          opt_b.use_subgroup_shuffle = (bool)(undefined1)local_628.w;
          opt_b.use_image_storage = (bool)local_628.w._1_1_;
          opt_b.use_tensor_storage = (bool)local_628.w._2_1_;
          opt_b.use_reserved_0 = (bool)local_628.w._3_1_;
          opt_b.use_shader_pack8 = (bool)(undefined1)local_628.dims;
          opt_b.use_subgroup_basic = (bool)local_628.dims._1_1_;
          opt_b.use_subgroup_vote = (bool)local_628.dims._2_1_;
          opt_b.use_subgroup_ballot = (bool)local_628.dims._3_1_;
          opt_b.use_local_pool_allocator = (bool)(undefined1)local_628.d;
          opt_b.use_shader_local_memory = (bool)local_628.d._1_1_;
          opt_b.use_cooperative_matrix = (bool)local_628.d._2_1_;
          opt_b.use_winograd23_convolution = (bool)local_628.d._3_1_;
          opt_b.flush_denormals = local_628.h;
          opt_b.use_winograd43_convolution = (bool)(undefined1)local_628.c;
          opt_b.use_winograd63_convolution = (bool)local_628.c._1_1_;
          opt_b.use_a53_a55_optimized_kernel = (bool)local_628.c._2_1_;
          opt_b.use_reserved_7 = (bool)local_628.c._3_1_;
          opt_b = (Option)CONCAT460(uVar15,opt_b._0_60_);
          local_478 = local_628.cstep;
        }
        else {
          Mat::create((Mat *)&opt_b,(int)local_530,auVar116._4_4_,iVar83,0x10,4,
                      opt->workspace_allocator);
        }
        for (uVar63 = 0; uVar63 != uVar48; uVar63 = uVar63 + 1) {
          pauVar94 = (undefined1 (*) [16])
                     (opt_b._0_8_ + local_478 * (long)opt_b.workspace_allocator * uVar63 + 0x30);
          for (uVar86 = 0; uVar86 != uVar22; uVar86 = uVar86 + 1) {
            pauVar21 = (undefined1 (*) [16])((long)((iVar67 * (int)uVar86) / 6) * 0x10 + (long)d1);
            pauVar40 = pauVar94;
            for (uVar35 = 0; pauVar23 = pauVar21, lVar28 = -0x50, uVar35 != uVar20;
                uVar35 = uVar35 + 1) {
              for (; lVar28 != 0; lVar28 = lVar28 + 0x10) {
                auVar102 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar23 + lVar68 * 4),
                                      *(undefined1 (*) [16])
                                       (*pauVar23 + (long)(int)(uVar54 * 4) * 4));
                auVar117 = vpsubd_avx(*(undefined1 (*) [16])
                                       (*pauVar23 + (long)(int)(uVar54 * 4) * 4),
                                      *(undefined1 (*) [16])(*pauVar23 + lVar68 * 4));
                auVar116 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar23 + lVar51 * 4),
                                      *(undefined1 (*) [16])
                                       (*pauVar23 + (long)(int)(uVar54 * 0xc) * 4));
                auVar103 = vpsubd_avx(*(undefined1 (*) [16])
                                       (*pauVar23 + (long)(int)(uVar54 * 0xc) * 4),
                                      *(undefined1 (*) [16])(*pauVar23 + lVar51 * 4));
                auVar101 = vpaddd_avx(auVar102,*pauVar23);
                auVar101 = vpaddd_avx(auVar101,auVar116);
                auVar133 = vpaddd_avx(auVar103,auVar103);
                auVar133 = vpaddd_avx(auVar133,auVar117);
                auVar116 = vpslld_avx(auVar116,2);
                auVar102 = vpaddd_avx(auVar116,auVar102);
                auVar116 = vpslld_avx512vl(*(undefined1 (*) [16])
                                            (*pauVar23 + (long)(int)(uVar54 * 0x14) * 4),2);
                auVar116 = vpaddd_avx(auVar116,auVar117);
                auVar117 = vpslld_avx(auVar103,3);
                auVar116 = vpaddd_avx(auVar116,auVar117);
                *(undefined1 (*) [16])(local_388 + lVar28) = auVar101;
                *(undefined1 (*) [16])(local_328 + lVar28) = auVar133;
                *(undefined1 (*) [16])(local_2c8 + lVar28) = auVar102;
                *(undefined1 (*) [16])(local_268 + lVar28) = auVar116;
                pauVar23 = (undefined1 (*) [16])(*pauVar23 + (long)(int)(uVar54 * 0x18) * 4);
              }
              auVar116 = vpslld_avx512vl(*(undefined1 (*) [16])
                                          (*pauVar23 + (long)(int)(uVar54 * 0x14) * 4),4);
              auVar102 = vpsubd_avx(*(undefined1 (*) [16])(*pauVar23 + (long)(int)(uVar54 * 4) * 4),
                                    *(undefined1 (*) [16])(*pauVar23 + lVar68 * 4));
              auVar117 = vpslld_avx(auVar102,2);
              auVar102 = vpaddd_avx(auVar117,auVar116);
              auVar101 = vpsubd_avx(*(undefined1 (*) [16])
                                     (*pauVar23 + (long)(int)(uVar54 * 0xc) * 4),
                                    *(undefined1 (*) [16])(*pauVar23 + lVar51 * 4));
              auVar116 = vpslld_avx(auVar101,5);
              local_268 = vpaddd_avx(auVar116,auVar102);
              auVar102 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar23 + lVar51 * 4),
                                    *(undefined1 (*) [16])
                                     (*pauVar23 + (long)(int)(uVar54 * 0xc) * 4));
              auVar103 = vpslld_avx(auVar102,4);
              auVar116 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar23 + lVar68 * 4),
                                    *(undefined1 (*) [16])(*pauVar23 + (long)(int)(uVar54 * 4) * 4))
              ;
              auVar133 = vpslld_avx(auVar116,2);
              local_2c8 = vpaddd_avx(auVar103,auVar133);
              auVar101 = vpslld_avx(auVar101,3);
              local_328 = vpaddd_avx(auVar101,auVar117);
              auVar116 = vpaddd_avx(auVar116,*pauVar23);
              auVar102 = vpaddd_avx(auVar116,auVar102);
              local_388 = vpslld_avx(auVar102,2);
              pauVar23 = pauVar40;
              for (lVar28 = 0x50; lVar28 != 0x1d0; lVar28 = lVar28 + 0x60) {
                auVar102 = vpaddd_avx(*(undefined1 (*) [16])((long)local_408 + lVar28),
                                      *(undefined1 (*) [16])(auStack_418 + lVar28));
                auVar117 = vpsubd_avx(*(undefined1 (*) [16])(auStack_418 + lVar28),
                                      *(undefined1 (*) [16])((long)local_408 + lVar28));
                auVar116 = vpaddd_avx(*(undefined1 (*) [16])((long)aiStack_3e8 + lVar28),
                                      *(undefined1 (*) [16])((long)local_3f8 + lVar28));
                auVar101 = vpaddd_avx(auVar102,*(undefined1 (*) [16])((long)w2 + lVar28));
                auVar103 = vpsubd_avx(*(undefined1 (*) [16])((long)local_3f8 + lVar28),
                                      *(undefined1 (*) [16])((long)aiStack_3e8 + lVar28));
                auVar101 = vpaddd_avx(auVar101,auVar116);
                auVar133 = vpaddd_avx(auVar103,auVar103);
                auVar133 = vpaddd_avx(auVar133,auVar117);
                auVar116 = vpslld_avx(auVar116,2);
                auVar116 = vpaddd_avx(auVar116,auVar102);
                auVar102 = vpaddd_avx(auVar117,*(undefined1 (*) [16])(&opt_q.lightmode + lVar28));
                auVar117 = vpslld_avx(auVar103,3);
                auVar117 = vpaddd_avx(auVar102,auVar117);
                auVar102 = vcvtdq2ps_avx(auVar101);
                auVar134._0_4_ = (int)(auVar102._0_4_ * 0.0017361111);
                auVar134._4_4_ = (int)(auVar102._4_4_ * 0.0017361111);
                auVar134._8_4_ = (int)(auVar102._8_4_ * 0.0017361111);
                auVar134._12_4_ = (int)(auVar102._12_4_ * 0.0017361111);
                auVar102 = vcvtdq2ps_avx(auVar133);
                auVar132._0_4_ = (int)(auVar102._0_4_ * 0.0017361111);
                auVar132._4_4_ = (int)(auVar102._4_4_ * 0.0017361111);
                auVar132._8_4_ = (int)(auVar102._8_4_ * 0.0017361111);
                auVar132._12_4_ = (int)(auVar102._12_4_ * 0.0017361111);
                auVar102 = vcvtdq2ps_avx(auVar116);
                auVar129._0_4_ = (int)(auVar102._0_4_ * 0.0017361111);
                auVar129._4_4_ = (int)(auVar102._4_4_ * 0.0017361111);
                auVar129._8_4_ = (int)(auVar102._8_4_ * 0.0017361111);
                auVar129._12_4_ = (int)(auVar102._12_4_ * 0.0017361111);
                auVar102 = vcvtdq2ps_avx(auVar117);
                auVar100._0_4_ = (int)(auVar102._0_4_ * 0.0017361111);
                auVar100._4_4_ = (int)(auVar102._4_4_ * 0.0017361111);
                auVar100._8_4_ = (int)(auVar102._8_4_ * 0.0017361111);
                auVar100._12_4_ = (int)(auVar102._12_4_ * 0.0017361111);
                pauVar23[-3] = auVar134;
                pauVar23[-2] = auVar132;
                pauVar23[-1] = auVar129;
                *pauVar23 = auVar100;
                pauVar23 = (undefined1 (*) [16])(*pauVar23 + (long)(int)(local_638._0_4_ << 4) * 4);
              }
              pauVar21 = pauVar21 + 1;
              pauVar40 = pauVar40 + 4;
            }
            pauVar94 = (undefined1 (*) [16])
                       (*pauVar94 + (long)(int)opt_b._44_4_ * (long)opt_b.workspace_allocator * 4);
          }
        }
        copy_cut_border((Mat *)&opt_b,&local_628,0,opt_b.flush_denormals - local_628.h,0,
                        opt_b._44_4_ - local_628.w,opt);
        if (opt_b.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_b.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_b.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_b.blob_allocator)->_vptr_Allocator == 0) {
            if (opt_b._32_8_ == 0) {
              free((void *)opt_b._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_b._32_8_ + 0x18))();
            }
          }
        }
        if (piStack_500 != (int *)0x0) {
          LOCK();
          *piStack_500 = *piStack_500 + -1;
          UNLOCK();
          if (*piStack_500 == 0) {
            if (pAStack_4e8 == (Allocator *)0x0) {
              free((void *)d1);
            }
            else {
              (*pAStack_4e8->_vptr_Allocator[3])();
            }
          }
        }
        piVar60 = (int *)CONCAT44(local_588.refcount._4_4_,local_588.refcount._0_4_);
        if (piVar60 != (int *)0x0) {
          LOCK();
          *piVar60 = *piVar60 + -1;
          UNLOCK();
          if (*piVar60 == 0) {
            pvVar38 = local_588.data;
            if (local_588.allocator == (Allocator *)0x0) {
LAB_001ce959:
              free(pvVar38);
            }
            else {
              (*(local_588.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        uVar85 = *(uint *)(p_Var5 + 0x30 + (long)&(this->weight_winograd23_data).data);
        uVar48 = (ulong)uVar85;
        iVar67 = *(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data);
        iVar19 = *(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data);
        iVar25 = *(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data);
        iVar89 = *(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data);
        local_6d8._0_4_ = local_698.w;
        lVar51 = (long)local_628.w;
        if (opt->use_sgemm_convolution == true) {
          opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
          opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
          opt_q = (Option)CONCAT460(uVar15,opt_q._0_60_);
          Mat::create((Mat *)&opt_q,local_628.h * local_628.w,uVar85 * uVar33,local_698.c,8,8,
                      opt->workspace_allocator);
          iVar83 = iVar25 * uVar54;
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar91 < 1) {
            uVar91 = 0;
          }
          if ((int)uVar33 < 1) {
            uVar20 = 0;
          }
          if ((int)uVar85 < 1) {
            uVar48 = 0;
          }
          if ((int)uVar55 < 1) {
            uVar55 = 0;
          }
          for (uVar22 = 0; uVar22 != uVar55; uVar22 = uVar22 + 1) {
            pvVar38 = (void *)(local_698.cstep * uVar22 * local_698.elemsize + (long)local_698.data)
            ;
            local_6d8 = pvVar38;
            puVar42 = (undefined8 *)opt_q._0_8_;
            for (uVar63 = 0; uVar63 != uVar48; uVar63 = uVar63 + 1) {
              for (uVar86 = 0; uVar86 != uVar20; uVar86 = uVar86 + 1) {
                puVar56 = (undefined8 *)
                          ((long)pvVar38 +
                          uVar86 * (long)iVar67 * 8 +
                          local_698.elemsize * (long)local_698.w * (long)iVar19 * uVar63);
                for (uVar33 = 0; uVar85 = uVar54, uVar33 != uVar91; uVar33 = uVar33 + 1) {
                  while (uVar85 != 0) {
                    *puVar42 = *puVar56;
                    puVar42 = puVar42 + 1;
                    puVar56 = puVar56 + iVar25;
                    uVar85 = uVar85 - 1;
                  }
                  puVar56 = puVar56 + ((long)(iVar80 * iVar89) - (long)iVar83);
                }
              }
            }
          }
          im2col_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
          if (opt_q.blob_allocator != (Allocator *)0x0) {
            LOCK();
            *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
                 *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
            UNLOCK();
            if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
              pvVar38 = (void *)opt_q._0_8_;
              if (opt_q._32_8_ == 0) goto LAB_001ce959;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        else {
          uVar84 = uVar85 * uVar33;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar84,
                     (allocator_type *)&local_588);
          local_6d8._0_4_ = iVar80 * iVar19 - iVar67 * uVar33;
          uVar24 = 0;
          if ((int)uVar33 < 1) {
            uVar20 = 0;
          }
          if ((int)uVar85 < 1) {
            uVar85 = 0;
          }
          iVar80 = 0;
          uVar48 = uVar20;
          iVar19 = 0;
          for (; uVar24 != uVar85; uVar24 = uVar24 + 1) {
            for (lVar68 = (long)iVar19; (int)uVar48 != lVar68; lVar68 = lVar68 + 1) {
              *(int *)(opt_q._0_8_ + lVar68 * 4) = iVar80;
              iVar80 = iVar80 + iVar67;
            }
            iVar80 = iVar80 + (int)local_6d8;
            uVar48 = (ulong)(uint)((int)uVar48 + (int)uVar20);
            iVar19 = iVar19 + (int)uVar20;
          }
          uVar48 = 0;
          uVar20 = (ulong)uVar84;
          if ((int)uVar84 < 1) {
            uVar20 = uVar48;
          }
          uVar22 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar22 = uVar48;
          }
          uVar63 = 0;
          if (0 < (int)uVar54) {
            uVar63 = (ulong)uVar54;
          }
          uVar86 = (ulong)uVar91;
          if ((int)uVar91 < 1) {
            uVar86 = uVar48;
          }
          uVar35 = (ulong)(uint)iVar83;
          if (iVar83 < 1) {
            uVar35 = uVar48;
          }
          for (; uVar48 != uVar35; uVar48 = uVar48 + 1) {
            local_6d8 = (void *)(local_628.cstep * uVar48 * local_628.elemsize +
                                (long)local_628.data);
            for (uVar69 = 0; uVar69 != uVar86; uVar69 = uVar69 + 1) {
              for (uVar62 = 0; uVar62 != uVar63; uVar62 = uVar62 + 1) {
                pvVar38 = (void *)((this->weight_data_tm).cstep * uVar48 *
                                   (this->weight_data_tm).elemsize +
                                  (long)(this->weight_data_tm).data);
                auVar109 = ZEXT1664((undefined1  [16])0x0);
                auVar120 = ZEXT1664((undefined1  [16])0x0);
                auVar123 = ZEXT1664((undefined1  [16])0x0);
                auVar125 = ZEXT1664((undefined1  [16])0x0);
                for (uVar37 = 0; uVar37 != uVar22; uVar37 = uVar37 + 1) {
                  for (lVar68 = 0; uVar20 * 4 != lVar68; lVar68 = lVar68 + 4) {
                    auVar116._8_8_ = 0;
                    auVar116._0_8_ =
                         *(ulong *)((long)local_698.data +
                                   (long)*(int *)(opt_q._0_8_ + lVar68) * 8 +
                                   local_698.cstep * local_698.elemsize * uVar37 +
                                   (long)(iVar25 * 8 * (int)uVar62) +
                                   (long)local_698.w * uVar69 * (long)iVar89 * local_698.elemsize);
                    auVar102 = vpcmpgtb_avx((undefined1  [16])0x0,auVar116);
                    auVar129 = vpunpcklbw_avx(auVar116,auVar102);
                    auVar102 = *(undefined1 (*) [16])((long)pvVar38 + lVar68 * 8);
                    auVar116 = *(undefined1 (*) [16])((long)pvVar38 + lVar68 * 8 + 0x10);
                    auVar101 = vpcmpgtb_avx((undefined1  [16])0x0,auVar102);
                    auVar133 = vpcmpgtb_avx((undefined1  [16])0x0,auVar116);
                    auVar117 = vpunpcklbw_avx(auVar102,auVar101);
                    auVar102 = vpunpckhbw_avx(auVar102,auVar101);
                    auVar101 = vpunpcklbw_avx(auVar116,auVar133);
                    auVar116 = vpunpckhbw_avx(auVar116,auVar133);
                    auVar134 = vpmullw_avx(auVar117,auVar129);
                    auVar117 = vpmulhw_avx(auVar117,auVar129);
                    auVar132 = vpmullw_avx(auVar129,auVar102);
                    auVar103 = vpmulhw_avx(auVar129,auVar102);
                    auVar124 = vpmullw_avx(auVar101,auVar129);
                    auVar100 = vpmulhw_avx(auVar101,auVar129);
                    auVar114 = vpmullw_avx(auVar129,auVar116);
                    auVar129 = vpmulhw_avx(auVar129,auVar116);
                    auVar102 = vpunpcklwd_avx(auVar134,auVar117);
                    auVar102 = vpaddd_avx(auVar125._0_16_,auVar102);
                    auVar116 = vpunpcklwd_avx(auVar132,auVar103);
                    auVar116 = vpaddd_avx(auVar123._0_16_,auVar116);
                    auVar101 = vpunpcklwd_avx(auVar124,auVar100);
                    auVar101 = vpaddd_avx(auVar120._0_16_,auVar101);
                    auVar133 = vpunpcklwd_avx(auVar114,auVar129);
                    auVar133 = vpaddd_avx(auVar109._0_16_,auVar133);
                    auVar117 = vpunpckhwd_avx(auVar134,auVar117);
                    auVar102 = vpaddd_avx(auVar102,auVar117);
                    auVar125 = ZEXT1664(auVar102);
                    auVar102 = vpunpckhwd_avx(auVar132,auVar103);
                    auVar102 = vpaddd_avx(auVar116,auVar102);
                    auVar123 = ZEXT1664(auVar102);
                    auVar102 = vpunpckhwd_avx(auVar124,auVar100);
                    auVar102 = vpaddd_avx(auVar101,auVar102);
                    auVar120 = ZEXT1664(auVar102);
                    auVar102 = vpunpckhwd_avx(auVar114,auVar129);
                    auVar102 = vpaddd_avx(auVar133,auVar102);
                    auVar109 = ZEXT1664(auVar102);
                  }
                  pvVar38 = (void *)((long)pvVar38 + uVar20 * 0x20);
                }
                auVar102 = vpunpckldq_avx(auVar125._0_16_,auVar123._0_16_);
                auVar133 = vpunpckldq_avx(auVar120._0_16_,auVar109._0_16_);
                auVar116 = vpunpckhdq_avx(auVar125._0_16_,auVar123._0_16_);
                auVar101 = vpunpckhdq_avx(auVar120._0_16_,auVar109._0_16_);
                auVar117 = vpunpcklqdq_avx(auVar102,auVar133);
                auVar102 = vpunpckhqdq_avx(auVar102,auVar133);
                auVar102 = vpaddd_avx(auVar117,auVar102);
                auVar133 = vpunpcklqdq_avx(auVar116,auVar101);
                auVar116 = vpunpckhqdq_avx(auVar116,auVar101);
                auVar116 = vpaddd_avx(auVar116,auVar133);
                auVar102 = vpaddd_avx(auVar102,auVar116);
                *(undefined1 (*) [16])((long)local_6d8 + uVar62 * 0x10) = auVar102;
              }
              local_6d8 = (void *)((long)local_6d8 + lVar51 * 0x10);
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
        }
      }
LAB_001ca52d:
      iVar83 = local_628.c;
      uVar55 = local_628.h;
      iVar80 = local_628.w;
      iVar19 = local_698.c;
      iVar67 = local_698.w;
      if ((iVar47 == 1) && (local_640._0_4_ == 4)) {
        p_Var5 = this->_vptr_Convolution_x86_avx512[-3];
        uVar54 = *(uint *)(p_Var5 + 0x2c + (long)&(this->weight_winograd23_data).data);
        uVar20 = (ulong)uVar54;
        uVar15 = opt_q._60_4_;
        if (uVar54 == 7) {
          if ((((*(int *)(p_Var5 + 0x30 + (long)&(this->weight_winograd23_data).data) != 7) ||
               (*(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1)) ||
              (*(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2 ||
              (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))))
          goto LAB_001cad69;
          opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
          opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
          opt_q = (Option)CONCAT460(uVar15,opt_q._0_60_);
          Mat::create((Mat *)&opt_q,local_628.h * local_628.w,0x31,local_698.c,1,1,
                      opt->workspace_allocator);
          uVar48 = 0;
          uVar20 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar20 = uVar48;
          }
          uVar22 = (ulong)(uint)iVar19;
          if (iVar19 < 1) {
            uVar22 = uVar48;
          }
          for (; uVar48 != uVar22; uVar48 = uVar48 + 1) {
            lVar51 = opt_q._0_8_;
            for (lVar68 = 0; lVar68 != 7; lVar68 = lVar68 + 1) {
              for (lVar28 = 0; lVar28 != 7; lVar28 = lVar28 + 1) {
                puVar36 = (undefined1 *)
                          ((long)local_698.data +
                          lVar28 + (long)local_698.w * local_698.elemsize * lVar68 +
                                   local_698.cstep * uVar48 * local_698.elemsize);
                for (iVar19 = 0; iVar19 != (int)uVar20; iVar19 = iVar19 + 1) {
                  puVar61 = puVar36 + (iVar67 - iVar80) * 2;
                  puVar75 = puVar36;
                  for (lVar49 = 0; (int)lVar49 + 3 < iVar80; lVar49 = lVar49 + 4) {
                    *(undefined1 *)(lVar51 + lVar49) = *puVar75;
                    *(undefined1 *)(lVar51 + 1 + lVar49) = puVar75[2];
                    *(undefined1 *)(lVar51 + 2 + lVar49) = puVar75[4];
                    *(undefined1 *)(lVar51 + 3 + lVar49) = puVar75[6];
                    puVar75 = puVar75 + 8;
                    puVar61 = puVar61 + 8;
                  }
                  for (; (int)lVar49 + 1 < iVar80; lVar49 = lVar49 + 2) {
                    *(undefined1 *)(lVar51 + lVar49) = *puVar75;
                    *(undefined1 *)(lVar51 + 1 + lVar49) = puVar75[2];
                    puVar75 = puVar75 + 4;
                    puVar61 = puVar61 + 4;
                  }
                  for (; (int)lVar49 < iVar80; lVar49 = lVar49 + 1) {
                    *(undefined1 *)(lVar51 + lVar49) = puVar36[lVar49 * 2];
                    puVar61 = puVar61 + 2;
                  }
                  lVar51 = lVar51 + lVar49;
                  puVar36 = puVar61;
                }
              }
            }
          }
          im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
          if (opt_q.blob_allocator != (Allocator *)0x0) {
            LOCK();
            *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
                 *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
            UNLOCK();
            if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
              if (opt_q._32_8_ == 0) goto LAB_001ccf7a;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        else if (uVar54 == 3) {
          if (*(int *)(p_Var5 + 0x30 + (long)&(this->weight_winograd23_data).data) != 3)
          goto LAB_001cad69;
          if (((*(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1) ||
              (*(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)))) {
            if ((((*(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))
            goto LAB_001cad69;
            opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
            opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
            opt_q = (Option)CONCAT460(uVar15,opt_q._0_60_);
            Mat::create((Mat *)&opt_q,local_628.h * local_628.w,9,local_698.c,1,1,
                        opt->workspace_allocator);
            uVar48 = 0;
            uVar20 = (ulong)uVar55;
            if ((int)uVar55 < 1) {
              uVar20 = uVar48;
            }
            uVar22 = (ulong)(uint)iVar19;
            if (iVar19 < 1) {
              uVar22 = uVar48;
            }
            for (; uVar48 != uVar22; uVar48 = uVar48 + 1) {
              lVar51 = opt_q._0_8_;
              for (lVar68 = 0; lVar68 != 3; lVar68 = lVar68 + 1) {
                for (lVar28 = 0; lVar28 != 3; lVar28 = lVar28 + 1) {
                  puVar36 = (undefined1 *)
                            ((long)local_698.data +
                            lVar28 + (long)local_698.w * local_698.elemsize * lVar68 +
                                     local_698.cstep * uVar48 * local_698.elemsize);
                  for (iVar19 = 0; iVar19 != (int)uVar20; iVar19 = iVar19 + 1) {
                    puVar61 = puVar36 + (iVar67 - iVar80) * 2;
                    puVar75 = puVar36;
                    for (lVar49 = 0; (int)lVar49 + 3 < iVar80; lVar49 = lVar49 + 4) {
                      *(undefined1 *)(lVar51 + lVar49) = *puVar75;
                      *(undefined1 *)(lVar51 + 1 + lVar49) = puVar75[2];
                      *(undefined1 *)(lVar51 + 2 + lVar49) = puVar75[4];
                      *(undefined1 *)(lVar51 + 3 + lVar49) = puVar75[6];
                      puVar75 = puVar75 + 8;
                      puVar61 = puVar61 + 8;
                    }
                    for (; (int)lVar49 + 1 < iVar80; lVar49 = lVar49 + 2) {
                      *(undefined1 *)(lVar51 + lVar49) = *puVar75;
                      *(undefined1 *)(lVar51 + 1 + lVar49) = puVar75[2];
                      puVar75 = puVar75 + 4;
                      puVar61 = puVar61 + 4;
                    }
                    for (; (int)lVar49 < iVar80; lVar49 = lVar49 + 1) {
                      *(undefined1 *)(lVar51 + lVar49) = puVar36[lVar49 * 2];
                      puVar61 = puVar61 + 2;
                    }
                    lVar51 = lVar51 + lVar49;
                    puVar36 = puVar61;
                  }
                }
              }
            }
            im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
            if (opt_q.blob_allocator != (Allocator *)0x0) {
              LOCK();
              *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
                   *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
              UNLOCK();
              if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
                if (opt_q._32_8_ == 0) goto LAB_001ccf7a;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
            goto LAB_001cb291;
          }
          opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
          opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
          opt_q = (Option)CONCAT460(uVar15,opt_q._0_60_);
          Mat::create((Mat *)&opt_q,local_628.h * local_628.w,9,local_698.c,1,1,
                      opt->workspace_allocator);
          uVar48 = 0;
          uVar20 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar20 = uVar48;
          }
          uVar22 = (ulong)(uint)iVar19;
          if (iVar19 < 1) {
            uVar22 = uVar48;
          }
          for (; uVar48 != uVar22; uVar48 = uVar48 + 1) {
            lVar51 = opt_q._0_8_;
            for (lVar68 = 0; lVar68 != 3; lVar68 = lVar68 + 1) {
              for (lVar28 = 0; lVar28 != 3; lVar28 = lVar28 + 1) {
                lVar49 = (long)local_698.data +
                         lVar28 + (long)local_698.w * local_698.elemsize * lVar68 +
                                  local_698.cstep * uVar48 * local_698.elemsize;
                for (iVar19 = 0; iVar19 != (int)uVar20; iVar19 = iVar19 + 1) {
                  for (lVar71 = 0; (int)lVar71 + 3 < iVar80; lVar71 = lVar71 + 4) {
                    *(undefined1 *)(lVar51 + lVar71) = *(undefined1 *)(lVar49 + lVar71);
                    *(undefined1 *)(lVar51 + 1 + lVar71) = *(undefined1 *)(lVar49 + 1 + lVar71);
                    *(undefined1 *)(lVar51 + 2 + lVar71) = *(undefined1 *)(lVar49 + 2 + lVar71);
                    *(undefined1 *)(lVar51 + 3 + lVar71) = *(undefined1 *)(lVar49 + 3 + lVar71);
                  }
                  for (; (int)lVar71 + 1 < iVar80; lVar71 = lVar71 + 2) {
                    *(undefined1 *)(lVar51 + lVar71) = *(undefined1 *)(lVar49 + lVar71);
                    *(undefined1 *)(lVar51 + 1 + lVar71) = *(undefined1 *)(lVar49 + 1 + lVar71);
                  }
                  for (; (int)lVar71 < iVar80; lVar71 = lVar71 + 1) {
                    *(undefined1 *)(lVar51 + lVar71) = *(undefined1 *)(lVar49 + lVar71);
                  }
                  lVar49 = lVar49 + (iVar67 - iVar80) + lVar71;
                  lVar51 = lVar51 + lVar71;
                }
              }
            }
          }
          im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
          if (opt_q.blob_allocator == (Allocator *)0x0) goto LAB_001cb291;
          LOCK();
          *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator != 0) goto LAB_001cb291;
          if (opt_q._32_8_ != 0) {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            goto LAB_001cb291;
          }
LAB_001ccf7a:
          free((void *)opt_q._0_8_);
        }
        else {
          if ((uVar54 == 1) &&
             (*(int *)(p_Var5 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)) {
            if (((*(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1) &&
                ((*(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
                 (*(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)))) &&
               (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) {
              conv1x1s1_sgemm_pack1to4_int8_sse(&local_698,&local_628,&this->weight_sgemm_data,opt);
              goto LAB_001ccb61;
            }
            if ((((*(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1) &&
                 (*(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                (*(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) == 2)) &&
               (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) == 2)) {
              opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
              opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
              opt_q = (Option)CONCAT460(uVar15,opt_q._0_60_);
              Mat::create((Mat *)&opt_q,local_628.w,local_628.h,local_698.c,local_698.elemsize,
                          local_698.elempack,opt->workspace_allocator);
              uVar20 = 0;
              if ((int)uVar55 < 1) {
                uVar55 = 0;
              }
              uVar48 = (ulong)(uint)iVar19;
              if (iVar19 < 1) {
                uVar48 = uVar20;
              }
              for (; uVar20 != uVar48; uVar20 = uVar20 + 1) {
                puVar36 = (undefined1 *)
                          (local_698.cstep * uVar20 * local_698.elemsize + (long)local_698.data);
                lVar51 = opt_q._0_8_;
                for (uVar54 = 0; uVar54 != uVar55; uVar54 = uVar54 + 1) {
                  puVar61 = puVar36 + (iVar67 - iVar80) * 2;
                  puVar75 = puVar36;
                  for (lVar68 = 0; (int)lVar68 + 3 < iVar80; lVar68 = lVar68 + 4) {
                    *(undefined1 *)(lVar51 + lVar68) = *puVar75;
                    *(undefined1 *)(lVar51 + 1 + lVar68) = puVar75[2];
                    *(undefined1 *)(lVar51 + 2 + lVar68) = puVar75[4];
                    *(undefined1 *)(lVar51 + 3 + lVar68) = puVar75[6];
                    puVar75 = puVar75 + 8;
                    puVar61 = puVar61 + 8;
                  }
                  for (; (int)lVar68 + 1 < iVar80; lVar68 = lVar68 + 2) {
                    *(undefined1 *)(lVar51 + lVar68) = *puVar75;
                    *(undefined1 *)(lVar51 + 1 + lVar68) = puVar75[2];
                    puVar75 = puVar75 + 4;
                    puVar61 = puVar61 + 4;
                  }
                  for (; (int)lVar68 < iVar80; lVar68 = lVar68 + 1) {
                    *(undefined1 *)(lVar51 + lVar68) = puVar36[lVar68 * 2];
                    puVar61 = puVar61 + 2;
                  }
                  lVar51 = lVar51 + lVar68;
                  puVar36 = puVar61;
                }
              }
              conv1x1s1_sgemm_pack1to4_int8_sse
                        ((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
              if (opt_q.blob_allocator != (Allocator *)0x0) {
                LOCK();
                *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
                     *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
                UNLOCK();
                if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
                  if (opt_q._32_8_ == 0) goto LAB_001ccf7a;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
              goto LAB_001cb291;
            }
          }
LAB_001cad69:
          uVar91 = *(uint *)(p_Var5 + 0x30 + (long)&(this->weight_winograd23_data).data);
          iVar25 = *(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data);
          iVar89 = *(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data);
          iVar92 = *(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data);
          lVar51 = (long)iVar92;
          iVar46 = *(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data);
          lVar68 = (long)local_628.w;
          uVar33 = uVar91 * uVar54;
          if (opt->use_sgemm_convolution == true) {
            opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
            opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
            opt_q = (Option)CONCAT460(uVar15,opt_q._0_60_);
            Mat::create((Mat *)&opt_q,local_628.h * local_628.w,uVar33,local_698.c,1,1,
                        opt->workspace_allocator);
            lVar68 = (long)(iVar92 * 2);
            uVar48 = 0;
            if ((int)uVar55 < 1) {
              uVar55 = 0;
            }
            if ((int)uVar54 < 1) {
              uVar20 = uVar48;
            }
            uVar22 = (ulong)uVar91;
            if ((int)uVar91 < 1) {
              uVar22 = uVar48;
            }
            uVar63 = (ulong)(uint)iVar19;
            if (iVar19 < 1) {
              uVar63 = uVar48;
            }
            for (; uVar48 != uVar63; uVar48 = uVar48 + 1) {
              lVar28 = opt_q._0_8_;
              for (uVar86 = 0; uVar86 != uVar22; uVar86 = uVar86 + 1) {
                for (uVar35 = 0; uVar35 != uVar20; uVar35 = uVar35 + 1) {
                  puVar36 = (undefined1 *)
                            ((long)local_698.data +
                            uVar35 * (long)iVar25 +
                            (long)local_698.w * local_698.elemsize * (long)iVar89 * uVar86 +
                            local_698.cstep * uVar48 * local_698.elemsize);
                  for (uVar54 = 0; uVar54 != uVar55; uVar54 = uVar54 + 1) {
                    lVar71 = 0;
                    puVar61 = puVar36;
                    for (lVar49 = 0; (int)lVar49 + 3 < iVar80; lVar49 = lVar49 + 4) {
                      *(undefined1 *)(lVar28 + lVar49) = *puVar61;
                      *(undefined1 *)(lVar28 + 1 + lVar49) = puVar61[lVar51];
                      *(undefined1 *)(lVar28 + 2 + lVar49) = puVar61[lVar68];
                      *(undefined1 *)(lVar28 + 3 + lVar49) = puVar61[iVar92 * 3];
                      puVar61 = puVar61 + iVar92 * 4;
                      lVar71 = lVar71 + iVar92 * 4;
                    }
                    for (; (int)lVar49 + 1 < iVar80; lVar49 = lVar49 + 2) {
                      *(undefined1 *)(lVar28 + lVar49) = *puVar61;
                      *(undefined1 *)(lVar28 + 1 + lVar49) = puVar61[lVar51];
                      puVar61 = puVar61 + lVar68;
                      lVar71 = lVar71 + lVar68;
                    }
                    for (; (int)lVar49 < iVar80; lVar49 = lVar49 + 1) {
                      *(undefined1 *)(lVar28 + lVar49) = puVar36[lVar71];
                      lVar71 = lVar71 + lVar51;
                    }
                    puVar36 = puVar36 + lVar71 + (iVar67 * iVar46 - iVar80 * iVar92);
                    lVar28 = lVar28 + lVar49;
                  }
                }
              }
            }
            im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
            if (opt_q.blob_allocator != (Allocator *)0x0) {
              LOCK();
              *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
                   *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
              UNLOCK();
              if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
                if (opt_q._32_8_ == 0) goto LAB_001ccf7a;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
          else {
            uVar48 = (ulong)(uint)local_628.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar33,
                       (allocator_type *)&local_588);
            local_6d8._0_4_ = iVar67 * iVar89 - iVar25 * uVar54;
            uVar85 = 0;
            if ((int)uVar54 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar91 < 1) {
              uVar91 = 0;
            }
            iVar92 = (int)uVar20;
            iVar89 = 0;
            iVar67 = 0;
            for (; uVar85 != uVar91; uVar85 = uVar85 + 1) {
              for (lVar51 = (long)iVar67; (int)uVar20 != lVar51; lVar51 = lVar51 + 1) {
                *(int *)(opt_q._0_8_ + lVar51 * 4) = iVar89;
                iVar89 = iVar89 + iVar25;
              }
              iVar89 = iVar89 + (int)local_6d8;
              uVar20 = (ulong)(uint)((int)uVar20 + iVar92);
              iVar67 = iVar67 + iVar92;
            }
            uVar22 = 0;
            uVar20 = (ulong)uVar33;
            if ((int)uVar33 < 1) {
              uVar20 = uVar22;
            }
            uVar63 = (ulong)(uint)iVar19;
            if (iVar19 < 1) {
              uVar63 = uVar22;
            }
            uVar86 = 0;
            if (0 < iVar80) {
              uVar86 = (ulong)(uint)iVar80;
            }
            uVar35 = (ulong)uVar55;
            if ((int)uVar55 < 1) {
              uVar35 = uVar22;
            }
            if (iVar83 < 1) {
              uVar48 = uVar22;
            }
            for (; uVar22 != uVar48; uVar22 = uVar22 + 1) {
              local_6d8 = (void *)(local_628.cstep * uVar22 * local_628.elemsize +
                                  (long)local_628.data);
              for (uVar69 = 0; uVar69 != uVar35; uVar69 = uVar69 + 1) {
                for (uVar62 = 0; uVar62 != uVar86; uVar62 = uVar62 + 1) {
                  pvVar38 = (void *)((this->weight_data_tm).cstep * uVar22 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  auVar109 = ZEXT1664((undefined1  [16])0x0);
                  for (uVar37 = 0; uVar37 != uVar63; uVar37 = uVar37 + 1) {
                    for (uVar76 = 0; uVar20 != uVar76; uVar76 = uVar76 + 1) {
                      auVar101 = vpbroadcastw_avx512vl();
                      auVar124._8_8_ = 0;
                      auVar124._0_8_ = *(ulong *)((long)pvVar38 + uVar76 * 4);
                      auVar102 = vpcmpgtb_avx((undefined1  [16])0x0,auVar124);
                      auVar102 = vpunpcklbw_avx(auVar124,auVar102);
                      auVar116 = vpmullw_avx(auVar101,auVar102);
                      auVar102 = vpmulhw_avx(auVar101,auVar102);
                      auVar102 = vpunpcklwd_avx(auVar116,auVar102);
                      auVar102 = vpaddd_avx(auVar109._0_16_,auVar102);
                      auVar109 = ZEXT1664(auVar102);
                    }
                    pvVar38 = (void *)((long)pvVar38 + uVar20 * 4);
                  }
                  *(undefined1 (*) [16])((long)local_6d8 + uVar62 * 0x10) = auVar109._0_16_;
                }
                local_6d8 = (void *)((long)local_6d8 + lVar68 * 0x10);
              }
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
          }
        }
      }
LAB_001cb291:
      iVar83 = local_628.c;
      uVar55 = local_628.h;
      iVar80 = local_628.w;
      sVar78 = local_698.cstep;
      uVar54 = local_698.c;
      iVar19 = local_698.w;
      iVar67 = local_698.elempack;
      uVar91 = local_628.c >> 2;
      uVar15 = opt_q._60_4_;
      if ((iVar47 == 8) && (local_640._0_4_ == 1)) {
        p_Var5 = this->_vptr_Convolution_x86_avx512[-3];
        uVar33 = *(uint *)(p_Var5 + 0x2c + (long)&(this->weight_winograd23_data).data);
        uVar20 = (ulong)uVar33;
        if ((uVar33 == 1) &&
           (*(int *)(p_Var5 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)) {
          if ((*(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1) &&
             (((*(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) {
            conv1x1s1_sgemm_pack8to1_int8_sse(&local_698,&local_628,&this->weight_sgemm_data,opt);
          }
          else {
            if ((((*(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))
            goto LAB_001cb519;
            opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
            opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
            opt_q = (Option)CONCAT460(uVar15,opt_q._0_60_);
            Mat::create((Mat *)&opt_q,local_628.w,local_628.h,local_698.c,local_698.elemsize,
                        local_698.elempack,opt->workspace_allocator);
            uVar48 = 0;
            uVar20 = (ulong)(uint)iVar80;
            if (iVar80 < 1) {
              uVar20 = uVar48;
            }
            if ((int)uVar55 < 1) {
              uVar55 = 0;
            }
            uVar22 = (ulong)uVar54;
            if ((int)uVar54 < 1) {
              uVar22 = uVar48;
            }
            for (; uVar48 != uVar22; uVar48 = uVar48 + 1) {
              puVar56 = (undefined8 *)
                        (local_698.cstep * uVar48 * local_698.elemsize + (long)local_698.data);
              puVar42 = (undefined8 *)opt_q._0_8_;
              for (uVar54 = 0; uVar63 = uVar20, uVar54 != uVar55; uVar54 = uVar54 + 1) {
                while (iVar67 = (int)uVar63, uVar63 = (ulong)(iVar67 - 1), iVar67 != 0) {
                  *puVar42 = *puVar56;
                  puVar56 = puVar56 + 2;
                  puVar42 = puVar42 + 1;
                }
                puVar56 = puVar56 + (iVar19 - iVar80) * 2;
              }
            }
            conv1x1s1_sgemm_pack8to1_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt)
            ;
            if (opt_q.blob_allocator != (Allocator *)0x0) {
              LOCK();
              *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
                   *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
              UNLOCK();
              if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
                pvVar38 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) goto LAB_001cfc4a;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
LAB_001cb519:
          if (((opt->use_winograd_convolution == true) && (uVar33 == 3)) &&
             ((opt->use_winograd43_convolution != false &&
              ((((*(int *)(p_Var5 + 0x30 + (long)&(this->weight_winograd23_data).data) == 3 &&
                 (*(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                (*(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
               ((*(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
                (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))))))) {
            auVar110._4_4_ = local_628.h;
            auVar110._0_4_ = local_628.w;
            uVar20 = (ulong)local_628.c;
            piVar60 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
            local_588.data = local_698.data;
            local_588.refcount._0_4_ = local_698.refcount._0_4_;
            local_588.refcount._4_4_ = local_698.refcount._4_4_;
            local_588.elemsize = local_698.elemsize;
            local_588.elempack = local_698.elempack;
            local_588.allocator = local_698.allocator;
            local_588.d = local_698.d;
            local_588.h = local_698.h;
            local_588.dims = local_698.dims;
            local_588.w = local_698.w;
            local_588.c = local_698.c;
            local_588.cstep = local_698.cstep;
            if (piVar60 != (int *)0x0) {
              LOCK();
              *piVar60 = *piVar60 + 1;
              UNLOCK();
            }
            auVar11._8_4_ = 3;
            auVar11._0_8_ = 0x300000003;
            auVar11._12_4_ = 3;
            auVar110._8_8_ = 0;
            auVar102 = vpaddd_avx512vl(auVar110,auVar11);
            auVar116 = vpsrad_avx(auVar102,0x1f);
            auVar116 = vpsrld_avx(auVar116,0x1e);
            auVar102 = vpaddd_avx(auVar102,auVar116);
            auVar12._8_4_ = 0xfffffffc;
            auVar12._0_8_ = 0xfffffffcfffffffc;
            auVar12._12_4_ = 0xfffffffc;
            auVar116 = vpandd_avx512vl(auVar102,auVar12);
            iVar80 = auVar116._0_4_;
            copy_make_border(&local_698,&local_588,0,(auVar116._4_4_ + 2) - local_698.h,0,
                             (iVar80 + 2) - local_698.w,0,0.0,opt);
            auVar102 = vpsrad_avx512vl(auVar102,2);
            uVar33 = auVar102._0_4_;
            asVar44._0_4_ = auVar102._4_4_;
            local_640._0_4_ = uVar33 * 6;
            iVar19 = uVar33 * 6 * asVar44._0_4_;
            d0[0] = 0;
            d0[1] = 0;
            d0[2] = 0;
            d0[3] = 0;
            uVar55 = (uint)((long)iVar19 / 6);
            local_648 = (void *)(ulong)auVar116._4_4_;
            Mat::create((Mat *)d0,uVar55,0x24,uVar54,(ulong)(uint)(iVar67 * 2),iVar67,
                        opt->workspace_allocator);
            iVar47 = local_698.c;
            asVar34[0] = 0;
            asVar34[1] = 0;
            asVar34[2] = 0;
            asVar34[3] = 0;
            asVar93[2] = 0;
            asVar93[3] = 0;
            asVar93[0] = (short)uVar33;
            asVar93[1] = (short)(uVar33 >> 0x10);
            if ((int)uVar33 < 1) {
              asVar93 = asVar34;
            }
            asVar44[2] = 0;
            asVar44[3] = 0;
            local_630 = asVar44;
            if ((int)asVar44._0_4_ < 1) {
              local_630 = asVar34;
            }
            asVar90[0] = 0;
            asVar90[1] = 0;
            asVar90[2] = 0;
            asVar90[3] = 0;
            if (0 < (int)uVar54) {
              asVar90[2] = 0;
              asVar90[3] = 0;
              local_698.c._0_2_ = (undefined2)uVar54;
              local_698.c._2_2_ = SUB42(uVar54,2);
              asVar90[0] = (undefined2)local_698.c;
              asVar90[1] = local_698.c._2_2_;
            }
            auVar111._8_2_ = 0xfffb;
            auVar111._0_8_ = 0xfffbfffbfffbfffb;
            auVar111._10_2_ = 0xfffb;
            auVar111._12_2_ = 0xfffb;
            auVar111._14_2_ = 0xfffb;
            while( true ) {
              if (asVar34 == asVar90) break;
              pauVar94 = (undefined1 (*) [16])
                         ((long)local_588.data +
                         local_588.cstep * local_588.elemsize * (long)asVar34 + 0x20);
              asVar27[0] = 0;
              asVar27[1] = 0;
              asVar27[2] = 0;
              asVar27[3] = 0;
              for (; asVar27 != local_630; asVar27 = (short  [4])((long)asVar27 + 1)) {
                pauVar21 = (undefined1 (*) [16])
                           ((long)((local_640._0_4_ * asVar27._0_4_) / 6) * 0x10 + (long)d0);
                asVar95[0] = 0;
                asVar95[1] = 0;
                asVar95[2] = 0;
                asVar95[3] = 0;
                pauVar40 = pauVar94;
                for (; asVar95 != asVar93; asVar95 = (short  [4])((long)asVar95 + 1)) {
                  pauVar23 = pauVar40;
                  for (lVar51 = -0x60; pauVar26 = pauVar21, lVar68 = 0x50, lVar51 != 0;
                      lVar51 = lVar51 + 0x10) {
                    auVar102 = pauVar23[-2];
                    auVar101 = pauVar23[-1];
                    auVar133 = *pauVar23;
                    auVar117 = vpcmpgtb_avx((undefined1  [16])0x0,auVar102);
                    auVar103 = vpcmpgtb_avx((undefined1  [16])0x0,auVar101);
                    auVar100 = vpcmpgtb_avx((undefined1  [16])0x0,auVar133);
                    auVar129 = vpunpcklbw_avx(auVar102,auVar117);
                    auVar134 = vpunpckhbw_avx(auVar102,auVar117);
                    auVar117 = vpunpcklbw_avx(auVar101,auVar103);
                    auVar103 = vpunpckhbw_avx(auVar101,auVar103);
                    auVar124 = vpunpcklbw_avx(auVar133,auVar100);
                    auVar132 = vpunpckhbw_avx(auVar133,auVar100);
                    auVar102 = vpsllw_avx(auVar129,2);
                    auVar102 = vpaddw_avx(auVar102,auVar124);
                    auVar101 = vpmullw_avx(auVar117,auVar111);
                    auVar102 = vpaddw_avx(auVar102,auVar101);
                    auVar101 = vpaddw_avx(auVar124,auVar103);
                    auVar133 = vpaddw_avx(auVar117,auVar134);
                    auVar133 = vpsllw_avx(auVar133,2);
                    auVar100 = vpsubw_avx(auVar101,auVar133);
                    auVar101 = vpsubw_avx(auVar124,auVar103);
                    auVar133 = vpsubw_avx(auVar134,auVar117);
                    auVar133 = vpsllw_avx(auVar133,2);
                    auVar101 = vpaddw_avx(auVar101,auVar133);
                    auVar117 = vpsubw_avx(auVar124,auVar117);
                    auVar133 = vpsubw_avx(auVar134,auVar103);
                    auVar133 = vpaddw_avx(auVar133,auVar133);
                    auVar129 = vpsubw_avx(auVar117,auVar133);
                    auVar133 = vpaddw_avx(auVar117,auVar133);
                    auVar117 = vpsllw_avx(auVar134,2);
                    auVar117 = vpaddw_avx(auVar117,auVar132);
                    auVar103 = vpmullw_avx(auVar103,auVar111);
                    auVar117 = vpaddw_avx(auVar117,auVar103);
                    *(undefined1 (*) [16])(auStack_378 + lVar51) = auVar102;
                    *(undefined1 (*) [16])(auStack_318 + lVar51) = auVar100;
                    *(undefined1 (*) [16])(auStack_2b8 + lVar51) = auVar101;
                    *(undefined1 (*) [16])(auStack_258 + lVar51) = auVar129;
                    *(undefined1 (*) [16])(auStack_1f8 + lVar51) = auVar133;
                    *(undefined1 (*) [16])((long)w1 + lVar51) = auVar117;
                    pauVar23 = (undefined1 (*) [16])(*pauVar23 + (iVar80 + 2) * 8);
                  }
                  for (; lVar68 != 0x290; lVar68 = lVar68 + 0x60) {
                    auVar102 = *(undefined1 (*) [16])(auStack_418 + lVar68);
                    auVar101 = *(undefined1 (*) [16])((long)local_408 + lVar68);
                    auVar133 = *(undefined1 (*) [16])((long)local_3f8 + lVar68);
                    auVar117 = *(undefined1 (*) [16])((long)aiStack_3e8 + lVar68);
                    auVar103 = vpsllw_avx512vl(*(undefined1 (*) [16])((long)w2 + lVar68),2);
                    auVar100 = vpmullw_avx(auVar101,auVar111);
                    auVar103 = vpaddw_avx(auVar103,auVar117);
                    auVar103 = vpaddw_avx(auVar100,auVar103);
                    auVar100 = vpaddw_avx(auVar117,auVar133);
                    auVar129 = vpaddw_avx(auVar101,auVar102);
                    auVar129 = vpsllw_avx(auVar129,2);
                    auVar129 = vpsubw_avx(auVar100,auVar129);
                    auVar100 = vpsubw_avx(auVar117,auVar133);
                    auVar134 = vpsubw_avx(auVar102,auVar101);
                    auVar134 = vpsllw_avx(auVar134,2);
                    auVar100 = vpaddw_avx(auVar134,auVar100);
                    auVar117 = vpsubw_avx(auVar117,auVar101);
                    auVar101 = vpsubw_avx(auVar102,auVar133);
                    auVar101 = vpaddw_avx(auVar101,auVar101);
                    auVar134 = vpsubw_avx(auVar117,auVar101);
                    auVar101 = vpaddw_avx(auVar117,auVar101);
                    auVar117 = vpsllw_avx(auVar102,2);
                    auVar102 = vpmullw_avx(auVar133,auVar111);
                    auVar102 = vpaddw_avx(auVar102,auVar117);
                    auVar102 = vpaddw_avx(auVar102,*(undefined1 (*) [16])(&opt_q.lightmode + lVar68)
                                         );
                    *pauVar26 = auVar103;
                    *(undefined1 (*) [16])(*pauVar26 + (long)(int)(uVar55 * 8) * 2) = auVar129;
                    *(undefined1 (*) [16])(*pauVar26 + (long)(int)(uVar55 << 4) * 2) = auVar100;
                    *(undefined1 (*) [16])(*pauVar26 + (long)(int)(uVar55 * 0x18) * 2) = auVar134;
                    *(undefined1 (*) [16])(*pauVar26 + (long)(int)(uVar55 << 5) * 2) = auVar101;
                    *(undefined1 (*) [16])(*pauVar26 + (long)(int)(uVar55 * 0x28) * 2) = auVar102;
                    pauVar26 = (undefined1 (*) [16])(*pauVar26 + (long)(int)(uVar55 * 0x30) * 2);
                  }
                  pauVar40 = pauVar40 + 2;
                  pauVar21 = pauVar21 + 1;
                }
                pauVar94 = (undefined1 (*) [16])
                           (*pauVar94 + (long)local_588.w * local_588.elemsize * 4);
              }
              asVar34 = (short  [4])((long)asVar34 + 1);
            }
            piVar60 = (int *)CONCAT44(local_588.refcount._4_4_,local_588.refcount._0_4_);
            local_698.c = iVar47;
            if (piVar60 != (int *)0x0) {
              LOCK();
              *piVar60 = *piVar60 + -1;
              UNLOCK();
              if (*piVar60 == 0) {
                if (local_588.allocator == (Allocator *)0x0) {
                  free(local_588.data);
                }
                else {
                  (*(local_588.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            auVar18 = (undefined1  [36])opt_q._28_36_;
            auVar13 = auStack_4ec;
            local_588.cstep = 0;
            local_588.data = (void *)0x0;
            local_588.refcount._0_4_ = 0;
            local_588.refcount._4_4_ = 0;
            local_588.elemsize = 0;
            local_588.elempack = 0;
            local_588.h = 0;
            local_588.d = 0;
            local_588.c = 0;
            local_588.allocator = (Allocator *)0x0;
            local_588.dims = 0;
            local_588.w = 0;
            _d1 = SUB1612((undefined1  [16])0x0,0);
            _d1 = ZEXT1228(_d1);
            auStack_4ec._32_4_ = auVar13._32_4_;
            _d1 = ZEXT3260(_d1);
            opt_q._0_12_ = SUB1612((undefined1  [16])0x0,0);
            opt_q._0_28_ = ZEXT1228((undefined1  [12])opt_q._0_12_);
            opt_q._60_4_ = auVar18._32_4_;
            opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
            if (iVar19 < 0x18) {
              uVar33 = uVar55;
              if (0xb < iVar19) {
                uVar54 = uVar54 * 2;
                uVar33 = (uVar55 & 1) + 1;
              }
            }
            else {
              uVar54 = uVar54 << 2;
              uVar33 = (uVar55 & 1) + ((uint)((ulong)((long)iVar19 / 6) >> 2) & 0x3fffffff) +
                       (uint)((uVar55 >> 1 & 1) != 0);
            }
            Mat::create((Mat *)&opt_q,uVar54,uVar33,0x24,(ulong)(uint)(iVar67 * 2),iVar67,
                        opt->workspace_allocator);
            lVar68 = (long)(int)uVar55;
            for (lVar51 = 0; lVar51 != 0x24; lVar51 = lVar51 + 1) {
              lVar28 = (long)(int)opt_q._44_4_ * (long)opt_q.workspace_allocator;
              lVar49 = lVar51 * lVar68;
              for (uVar48 = 0; (long)(uVar48 | 3) < lVar68; uVar48 = uVar48 + 4) {
                pauVar57 = (undefined1 (*) [64])((uVar48 >> 2) * lVar28 + opt_q._0_8_);
                asVar59 = asVar90;
                while (iVar67 = asVar59._0_4_, asVar59._0_4_ = iVar67 - 1, asVar59[2] = 0,
                      asVar59[3] = 0, iVar67 != 0) {
                  auVar109 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((uVar48 + lVar49) * 0x10 + (long)d0));
                  auVar109 = vmovdqu64_avx512f(auVar109);
                  *pauVar57 = auVar109;
                  pauVar57 = pauVar57 + 1;
                }
              }
              for (; (long)(uVar48 | 1) < lVar68; uVar48 = uVar48 + 2) {
                pauVar58 = (undefined1 (*) [32])
                           ((ulong)(((uint)(uVar48 >> 2) & 0x3fffffff) +
                                   (uint)(((uint)uVar48 >> 1 & 1) != 0)) * lVar28 + opt_q._0_8_);
                asVar96 = asVar90;
                while (iVar67 = asVar96._0_4_, asVar96._0_4_ = iVar67 - 1, asVar96[2] = 0,
                      asVar96[3] = 0, iVar67 != 0) {
                  *pauVar58 = *(undefined1 (*) [32])((uVar48 + lVar49) * 0x10 + (long)d0);
                  pauVar58 = pauVar58 + 1;
                }
              }
              for (; (long)uVar48 < lVar68; uVar48 = uVar48 + 1) {
                pauVar94 = (undefined1 (*) [16])
                           ((ulong)(((uint)uVar48 & 1) + ((uint)(uVar48 >> 2) & 0x3fffffff) +
                                   (uint)(((uint)uVar48 >> 1 & 1) != 0)) * lVar28 + opt_q._0_8_);
                asVar70 = asVar90;
                while (iVar67 = asVar70._0_4_, asVar70._0_4_ = iVar67 - 1, asVar70[2] = 0,
                      asVar70[3] = 0, iVar67 != 0) {
                  *pauVar94 = *(undefined1 (*) [16])((uVar48 + lVar49) * 0x10 + (long)d0);
                  pauVar94 = pauVar94 + 1;
                }
              }
            }
            d0[0] = 0;
            d0[1] = 0;
            d0[2] = 0;
            d0[3] = 0;
            Mat::create((Mat *)d1,uVar55,0x24,iVar83,4,1,opt->workspace_allocator);
            local_700 = (this->weight_winograd43_data).data;
            sVar78 = (this->weight_winograd43_data).elemsize;
            uVar48 = (ulong)uVar91;
            if ((int)uVar91 < 1) {
              uVar48 = 0;
            }
            local_638 = (short  [4])((this->weight_winograd43_data).cstep * sVar78);
            for (uVar22 = 0; uVar22 != uVar48; uVar22 = uVar22 + 1) {
              iVar67 = (this->weight_winograd43_data).w;
              asVar34 = d1;
              pvVar38 = local_700;
              asVar44 = d1;
              asVar59 = d1;
              asVar96 = d1;
              for (lVar51 = 0; lVar51 != 0x24; lVar51 = lVar51 + 1) {
                lVar49 = (long)(int)opt_q._44_4_ * (long)opt_q.workspace_allocator;
                lVar28 = opt_q._0_8_;
                for (uVar63 = 0; (long)(uVar63 | 3) < lVar68; uVar63 = uVar63 + 4) {
                  auVar109 = ZEXT1664((undefined1  [16])0x0);
                  lVar71 = 0;
                  auVar120 = ZEXT1664((undefined1  [16])0x0);
                  auVar123 = ZEXT1664((undefined1  [16])0x0);
                  auVar125 = ZEXT1664((undefined1  [16])0x0);
                  auVar126 = ZEXT1664((undefined1  [16])0x0);
                  auVar127 = ZEXT1664((undefined1  [16])0x0);
                  auVar128 = ZEXT1664((undefined1  [16])0x0);
                  auVar131 = ZEXT1664((undefined1  [16])0x0);
                  asVar50 = asVar90;
                  while( true ) {
                    iVar47 = asVar50._0_4_;
                    asVar50._0_4_ = iVar47 - 1;
                    asVar50[2] = 0;
                    asVar50[3] = 0;
                    auVar106 = auVar128._0_32_;
                    auVar130 = auVar131._0_32_;
                    auVar107 = auVar126._0_32_;
                    auVar108 = auVar127._0_32_;
                    auVar104 = auVar123._0_32_;
                    auVar105 = auVar125._0_32_;
                    auVar119 = auVar109._0_32_;
                    auVar122 = auVar120._0_32_;
                    if (iVar47 == 0) break;
                    auVar135 = *(undefined1 (*) [32])((long)pvVar38 + lVar71);
                    auVar136 = *(undefined1 (*) [32])((long)pvVar38 + lVar71 + 0x20);
                    auVar1 = *(undefined1 (*) [32])(lVar28 + lVar71);
                    auVar2 = *(undefined1 (*) [32])(lVar28 + 0x20 + lVar71);
                    auVar10 = vpermq_avx2(auVar1,0x4e);
                    auVar8 = vpmaddwd_avx2(auVar1,auVar135);
                    auVar130 = vpaddd_avx2(auVar8,auVar130);
                    auVar131 = ZEXT3264(auVar130);
                    auVar130 = vpmaddwd_avx2(auVar10,auVar135);
                    auVar106 = vpaddd_avx2(auVar130,auVar106);
                    auVar128 = ZEXT3264(auVar106);
                    auVar106 = vpmaddwd_avx2(auVar1,auVar136);
                    auVar108 = vpaddd_avx2(auVar106,auVar108);
                    auVar127 = ZEXT3264(auVar108);
                    auVar108 = vpmaddwd_avx2(auVar10,auVar136);
                    auVar107 = vpaddd_avx2(auVar108,auVar107);
                    auVar126 = ZEXT3264(auVar107);
                    auVar108 = vpermq_avx2(auVar2,0x4e);
                    auVar107 = vpmaddwd_avx2(auVar2,auVar135);
                    auVar105 = vpaddd_avx2(auVar107,auVar105);
                    auVar125 = ZEXT3264(auVar105);
                    auVar105 = vpmaddwd_avx2(auVar108,auVar135);
                    auVar104 = vpaddd_avx2(auVar105,auVar104);
                    auVar123 = ZEXT3264(auVar104);
                    auVar104 = vpmaddwd_avx2(auVar2,auVar136);
                    auVar122 = vpaddd_avx2(auVar104,auVar122);
                    auVar120 = ZEXT3264(auVar122);
                    auVar122 = vpmaddwd_avx2(auVar108,auVar136);
                    auVar119 = vpaddd_avx2(auVar122,auVar119);
                    auVar109 = ZEXT3264(auVar119);
                    lVar71 = lVar71 + 0x40;
                  }
                  auVar135 = vpunpckldq_avx2(auVar130,auVar106);
                  auVar136 = vpunpckldq_avx2(auVar108,auVar107);
                  auVar106 = vpunpckhdq_avx2(auVar130,auVar106);
                  auVar108 = vpunpckhdq_avx2(auVar108,auVar107);
                  auVar130 = vpunpcklqdq_avx2(auVar135,auVar136);
                  auVar107 = vpunpckhqdq_avx2(auVar135,auVar136);
                  auVar107 = vpaddd_avx2(auVar130,auVar107);
                  auVar130 = vpunpcklqdq_avx2(auVar106,auVar108);
                  auVar108 = vpunpckhqdq_avx2(auVar106,auVar108);
                  auVar108 = vpaddd_avx2(auVar108,auVar130);
                  auVar107 = vpaddd_avx2(auVar107,auVar108);
                  auVar108 = vpunpckldq_avx2(auVar105,auVar104);
                  auVar106 = vpunpckldq_avx2(auVar122,auVar119);
                  auVar104 = vpunpckhdq_avx2(auVar105,auVar104);
                  auVar122 = vpunpckhdq_avx2(auVar122,auVar119);
                  auVar105 = vpunpcklqdq_avx2(auVar108,auVar106);
                  auVar119 = vpunpckhqdq_avx2(auVar108,auVar106);
                  auVar119 = vpaddd_avx2(auVar105,auVar119);
                  auVar105 = vpunpcklqdq_avx2(auVar104,auVar122);
                  *(int *)asVar59 = auVar107._0_4_;
                  *(int *)asVar44 = auVar107._20_4_;
                  auVar122 = vpunpckhqdq_avx2(auVar104,auVar122);
                  *(int *)asVar96 = auVar107._8_4_;
                  auVar122 = vpaddd_avx2(auVar122,auVar105);
                  *(int *)asVar34 = auVar107._28_4_;
                  auVar119 = vpaddd_avx2(auVar119,auVar122);
                  *(int *)((long)asVar59 + 4) = auVar107._4_4_;
                  *(int *)((long)asVar44 + 4) = auVar107._16_4_;
                  *(int *)((long)asVar96 + 4) = auVar107._12_4_;
                  *(int *)((long)asVar34 + 4) = auVar107._24_4_;
                  *(int *)((long)asVar59 + 8) = auVar119._0_4_;
                  *(int *)((long)asVar44 + 8) = auVar119._20_4_;
                  *(int *)((long)asVar96 + 8) = auVar119._8_4_;
                  *(int *)((long)asVar34 + 8) = auVar119._28_4_;
                  *(int *)((long)asVar59 + 0xc) = auVar119._4_4_;
                  *(int *)((long)asVar44 + 0xc) = auVar119._16_4_;
                  *(int *)((long)asVar96 + 0xc) = auVar119._12_4_;
                  *(int *)((long)asVar34 + 0xc) = auVar119._24_4_;
                  asVar59 = (short  [4])((long)asVar59 + 0x10);
                  asVar44 = (short  [4])((long)asVar44 + 0x10);
                  asVar96 = (short  [4])((long)asVar96 + 0x10);
                  asVar34 = (short  [4])((long)asVar34 + 0x10);
                  lVar28 = lVar28 + lVar49;
                }
                bVar43 = 0;
                for (; (int)((uint)uVar63 | 1) < (int)uVar55; uVar63 = (ulong)((uint)uVar63 + 2)) {
                  auVar109 = ZEXT1664((undefined1  [16])0x0);
                  lVar28 = 0;
                  auVar120 = ZEXT1664((undefined1  [16])0x0);
                  auVar123 = ZEXT1664((undefined1  [16])0x0);
                  auVar125 = ZEXT1664((undefined1  [16])0x0);
                  asVar77 = asVar90;
                  while( true ) {
                    iVar47 = asVar77._0_4_;
                    asVar77._0_4_ = iVar47 - 1;
                    asVar77[2] = 0;
                    asVar77[3] = 0;
                    auVar104 = auVar123._0_32_;
                    auVar105 = auVar125._0_32_;
                    auVar119 = auVar109._0_32_;
                    auVar122 = auVar120._0_32_;
                    if (iVar47 == 0) break;
                    auVar107 = *(undefined1 (*) [32])
                                ((ulong)((bVar43 & 1) + ((uint)(uVar63 >> 2) & 0x3fffffff)) * lVar49
                                 + opt_q._0_8_ + lVar28);
                    auVar108 = *(undefined1 (*) [32])((long)pvVar38 + lVar28 * 2);
                    auVar106 = *(undefined1 (*) [32])((long)pvVar38 + lVar28 * 2 + 0x20);
                    auVar135 = vpermq_avx2(auVar107,0x4e);
                    auVar130 = vpmaddwd_avx2(auVar107,auVar108);
                    auVar105 = vpaddd_avx2(auVar130,auVar105);
                    auVar125 = ZEXT3264(auVar105);
                    auVar105 = vpmaddwd_avx2(auVar135,auVar108);
                    auVar104 = vpaddd_avx2(auVar105,auVar104);
                    auVar123 = ZEXT3264(auVar104);
                    auVar104 = vpmaddwd_avx2(auVar107,auVar106);
                    auVar119 = vpaddd_avx2(auVar104,auVar119);
                    auVar109 = ZEXT3264(auVar119);
                    auVar119 = vpmaddwd_avx2(auVar135,auVar106);
                    auVar119 = vpaddd_avx2(auVar119,auVar122);
                    auVar120 = ZEXT3264(auVar119);
                    lVar28 = lVar28 + 0x20;
                  }
                  auVar107 = vpunpckldq_avx2(auVar105,auVar104);
                  auVar108 = vpunpckldq_avx2(auVar119,auVar122);
                  auVar104 = vpunpckhdq_avx2(auVar105,auVar104);
                  auVar122 = vpunpckhdq_avx2(auVar119,auVar122);
                  auVar105 = vpunpcklqdq_avx2(auVar107,auVar108);
                  auVar119 = vpunpckhqdq_avx2(auVar107,auVar108);
                  auVar119 = vpaddd_avx2(auVar105,auVar119);
                  auVar105 = vpunpcklqdq_avx2(auVar104,auVar122);
                  auVar122 = vpunpckhqdq_avx2(auVar104,auVar122);
                  auVar122 = vpaddd_avx2(auVar122,auVar105);
                  auVar119 = vpaddd_avx2(auVar119,auVar122);
                  *(int *)asVar59 = auVar119._0_4_;
                  *(int *)asVar44 = auVar119._20_4_;
                  *(int *)asVar96 = auVar119._8_4_;
                  *(int *)asVar34 = auVar119._28_4_;
                  *(int *)((long)asVar59 + 4) = auVar119._4_4_;
                  *(int *)((long)asVar44 + 4) = auVar119._16_4_;
                  *(int *)((long)asVar96 + 4) = auVar119._12_4_;
                  *(int *)((long)asVar34 + 4) = auVar119._24_4_;
                  asVar59 = (short  [4])((long)asVar59 + 8);
                  asVar44 = (short  [4])((long)asVar44 + 8);
                  asVar96 = (short  [4])((long)asVar96 + 8);
                  asVar34 = (short  [4])((long)asVar34 + 8);
                  bVar43 = bVar43 + 1;
                }
                while( true ) {
                  uVar54 = (uint)uVar63;
                  if ((int)uVar55 <= (int)uVar54) break;
                  auVar109 = ZEXT1664((undefined1  [16])0x0);
                  lVar28 = 0;
                  auVar120 = ZEXT1664((undefined1  [16])0x0);
                  asVar72 = asVar90;
                  while (iVar47 = asVar72._0_4_, asVar72._0_4_ = iVar47 - 1, asVar72[2] = 0,
                        asVar72[3] = 0, iVar47 != 0) {
                    auVar102 = *(undefined1 (*) [16])
                                ((ulong)((uVar54 & 1) + ((uint)(uVar63 >> 2) & 0x3fffffff) +
                                        (uint)((uVar54 >> 1 & 1) != 0)) * lVar49 + opt_q._0_8_ +
                                lVar28);
                    auVar122._16_16_ = auVar102;
                    auVar122._0_16_ = auVar102;
                    auVar119 = vpmaddwd_avx2(auVar122,*(undefined1 (*) [32])
                                                       ((long)pvVar38 + lVar28 * 4));
                    auVar119 = vpaddd_avx2(auVar119,auVar109._0_32_);
                    auVar109 = ZEXT3264(auVar119);
                    auVar119 = vpmaddwd_avx2(auVar122,*(undefined1 (*) [32])
                                                       ((long)pvVar38 + lVar28 * 4 + 0x20));
                    auVar119 = vpaddd_avx2(auVar119,auVar120._0_32_);
                    auVar120 = ZEXT3264(auVar119);
                    lVar28 = lVar28 + 0x10;
                  }
                  auVar102 = vpunpckldq_avx(auVar109._0_16_,auVar109._16_16_);
                  auVar117 = vpunpckldq_avx(auVar120._0_16_,auVar120._16_16_);
                  auVar101 = vpunpckhdq_avx(auVar109._0_16_,auVar109._16_16_);
                  auVar133 = vpunpckhdq_avx(auVar120._0_16_,auVar120._16_16_);
                  auVar103 = vpunpcklqdq_avx(auVar102,auVar117);
                  auVar102 = vpunpckhqdq_avx(auVar102,auVar117);
                  auVar102 = vpaddd_avx(auVar103,auVar102);
                  auVar117 = vpunpcklqdq_avx(auVar101,auVar133);
                  auVar101 = vpunpckhqdq_avx(auVar101,auVar133);
                  auVar101 = vpaddd_avx(auVar101,auVar117);
                  auVar102 = vpaddd_avx(auVar102,auVar101);
                  *(int *)asVar59 = auVar102._0_4_;
                  *(int *)asVar44 = auVar102._4_4_;
                  *(int *)asVar96 = auVar102._8_4_;
                  *(int *)asVar34 = auVar102._12_4_;
                  asVar59 = (short  [4])((long)asVar59 + 4);
                  asVar44 = (short  [4])((long)asVar44 + 4);
                  asVar96 = (short  [4])((long)asVar96 + 4);
                  asVar34 = (short  [4])((long)asVar34 + 4);
                  uVar63 = (ulong)(uVar54 + 1);
                }
                pvVar38 = (void *)((long)pvVar38 + (long)iVar67 * sVar78);
              }
              local_700 = (void *)((long)local_700 + (long)local_638);
            }
            pvVar38 = (this->weight_winograd43_data).data;
            sVar78 = (this->weight_winograd43_data).elemsize;
            sVar66 = (this->weight_winograd43_data).cstep;
            for (uVar48 = uVar20 & 0xfffffffffffffffc; (long)uVar48 < (long)uVar20;
                uVar48 = uVar48 + 1) {
              uVar22 = (ulong)(uint)((int)uVar48 >> 0x1f) << 0x20 | uVar48 & 0xffffffff;
              iVar67 = (this->weight_winograd43_data).w;
              pvVar39 = (void *)((long)((int)((long)uVar22 % 4) + (int)((long)uVar22 / 4)) *
                                 sVar66 * sVar78 + (long)pvVar38);
              asVar34 = d1;
              for (lVar51 = 0; lVar51 != 0x24; lVar51 = lVar51 + 1) {
                lVar49 = (long)(int)opt_q._44_4_ * (long)opt_q.workspace_allocator;
                lVar28 = opt_q._0_8_;
                for (uVar22 = 0; (long)(uVar22 | 3) < lVar68; uVar22 = uVar22 + 4) {
                  auVar120 = ZEXT1664((undefined1  [16])0x0);
                  lVar71 = 0;
                  auVar109 = ZEXT1664((undefined1  [16])0x0);
                  asVar73 = asVar90;
                  while (iVar47 = asVar73._0_4_, asVar73._0_4_ = iVar47 - 1, asVar73[2] = 0,
                        asVar73[3] = 0, iVar47 != 0) {
                    auVar104._16_16_ = *(undefined1 (*) [16])((long)pvVar39 + lVar71);
                    auVar104._0_16_ = *(undefined1 (*) [16])((long)pvVar39 + lVar71);
                    auVar119 = vpmaddwd_avx2(auVar104,*(undefined1 (*) [32])(lVar28 + lVar71 * 4));
                    auVar119 = vpaddd_avx2(auVar119,auVar120._0_32_);
                    auVar120 = ZEXT3264(auVar119);
                    auVar119 = vpmaddwd_avx2(auVar104,*(undefined1 (*) [32])
                                                       (lVar28 + 0x20 + lVar71 * 4));
                    auVar119 = vpaddd_avx2(auVar119,auVar109._0_32_);
                    auVar109 = ZEXT3264(auVar119);
                    lVar71 = lVar71 + 0x10;
                  }
                  auVar102 = vpshufd_avx(auVar120._0_16_,0xee);
                  auVar102 = vpaddd_avx(auVar102,auVar120._0_16_);
                  auVar101 = vpshufd_avx(auVar120._16_16_,0xee);
                  auVar101 = vpaddd_avx(auVar101,auVar120._16_16_);
                  auVar101 = vphaddd_avx(auVar102,auVar101);
                  auVar102 = vpshufd_avx(auVar109._0_16_,0xee);
                  auVar102 = vpaddd_avx(auVar102,auVar109._0_16_);
                  auVar133 = vphaddd_avx(auVar102,auVar102);
                  auVar102 = vpshufd_avx(auVar109._16_16_,0xee);
                  auVar102 = vpaddd_avx(auVar102,auVar109._16_16_);
                  auVar102 = vphaddd_avx(auVar102,auVar102);
                  auVar101 = vpshufd_avx(auVar101,0xe8);
                  auVar101 = vpunpcklqdq_avx(auVar101,auVar133);
                  auVar112._0_4_ = auVar102._0_4_;
                  auVar112._4_4_ = auVar112._0_4_;
                  auVar112._8_4_ = auVar112._0_4_;
                  auVar112._12_4_ = auVar112._0_4_;
                  auVar102 = vpblendd_avx2(auVar101,auVar112,8);
                  *(undefined1 (*) [16])asVar34 = auVar102;
                  asVar34 = (short  [4])((long)asVar34 + 0x10);
                  lVar28 = lVar28 + lVar49;
                }
                bVar43 = 0;
                for (; (int)((uint)uVar22 | 1) < (int)uVar55; uVar22 = (ulong)((uint)uVar22 + 2)) {
                  auVar109 = ZEXT1664((undefined1  [16])0x0);
                  lVar28 = 0;
                  asVar29 = asVar90;
                  while (iVar47 = asVar29._0_4_, asVar29._0_4_ = iVar47 - 1, asVar29[2] = 0,
                        asVar29[3] = 0, iVar47 != 0) {
                    auVar119._16_16_ = *(undefined1 (*) [16])((long)pvVar39 + lVar28);
                    auVar119._0_16_ = *(undefined1 (*) [16])((long)pvVar39 + lVar28);
                    auVar119 = vpmaddwd_avx2(auVar119,*(undefined1 (*) [32])
                                                       ((ulong)((bVar43 & 1) +
                                                               ((uint)(uVar22 >> 2) & 0x3fffffff)) *
                                                        lVar49 + opt_q._0_8_ + lVar28 * 2));
                    auVar119 = vpaddd_avx2(auVar119,auVar109._0_32_);
                    auVar109 = ZEXT3264(auVar119);
                    lVar28 = lVar28 + 0x10;
                  }
                  auVar102 = vpshufd_avx(auVar109._0_16_,0xee);
                  auVar102 = vpaddd_avx(auVar102,auVar109._0_16_);
                  auVar101 = vpshufd_avx(auVar109._16_16_,0xee);
                  auVar101 = vpaddd_avx(auVar101,auVar109._16_16_);
                  auVar102 = vphaddd_avx(auVar102,auVar101);
                  auVar102 = vpshufd_avx(auVar102,0xe8);
                  *(long *)asVar34 = auVar102._0_8_;
                  asVar34 = (short  [4])((long)asVar34 + 8);
                  bVar43 = bVar43 + 1;
                }
                while( true ) {
                  uVar54 = (uint)uVar22;
                  if ((int)uVar55 <= (int)uVar54) break;
                  auVar109 = ZEXT1664((undefined1  [16])0x0);
                  lVar28 = 0;
                  asVar30 = asVar90;
                  while( true ) {
                    iVar47 = asVar30._0_4_;
                    asVar30._0_4_ = iVar47 - 1;
                    asVar30[2] = 0;
                    asVar30[3] = 0;
                    auVar102 = auVar109._0_16_;
                    if (iVar47 == 0) break;
                    auVar101 = vpmaddwd_avx(*(undefined1 (*) [16])
                                             ((ulong)((uVar54 & 1) +
                                                      ((uint)(uVar22 >> 2) & 0x3fffffff) +
                                                     (uint)((uVar54 >> 1 & 1) != 0)) * lVar49 +
                                              opt_q._0_8_ + lVar28),
                                            *(undefined1 (*) [16])((long)pvVar39 + lVar28));
                    auVar102 = vpaddd_avx(auVar101,auVar102);
                    auVar109 = ZEXT1664(auVar102);
                    lVar28 = lVar28 + 0x10;
                  }
                  auVar102 = vphaddd_avx(auVar102,auVar102);
                  auVar102 = vphaddd_avx(auVar102,auVar102);
                  *(int *)asVar34 = auVar102._0_4_;
                  asVar34 = (short  [4])((long)asVar34 + 4);
                  uVar22 = (ulong)(uVar54 + 1);
                }
                pvVar39 = (void *)((long)pvVar39 + (long)iVar67 * sVar78);
              }
            }
            if (opt_q.blob_allocator != (Allocator *)0x0) {
              LOCK();
              *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
                   *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
              UNLOCK();
              if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
                if (opt_q._32_8_ == 0) {
                  free((void *)opt_q._0_8_);
                }
                else {
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
            }
            auVar13 = (undefined1  [36])opt_b._28_36_;
            d0[0] = 0;
            d0[1] = 0;
            d0[2] = 0;
            d0[3] = 0;
            opt_b._0_12_ = SUB1612((undefined1  [16])0x0,0);
            opt_b._0_28_ = ZEXT1228((undefined1  [12])opt_b._0_12_);
            opt_b._60_4_ = auVar13._32_4_;
            uVar15 = opt_b._60_4_;
            opt_b._0_60_ = ZEXT3260((undefined1  [32])opt_b._0_32_);
            OVar14 = opt_b;
            auVar113._4_4_ = local_628.h;
            auVar113._0_4_ = local_628.w;
            auVar113._8_8_ = 0;
            uVar20 = vpcmpd_avx512vl(auVar113,auVar116,4);
            if ((uVar20 & 3) == 0) {
              piVar60 = (int *)CONCAT44(local_628.refcount._4_4_,local_628.refcount._0_4_);
              if (piVar60 != (int *)0x0) {
                LOCK();
                *piVar60 = *piVar60 + 1;
                UNLOCK();
              }
              opt_b.blob_allocator._4_4_ = local_628.refcount._4_4_;
              opt_b.blob_allocator._0_4_ = local_628.refcount._0_4_;
              opt_b._0_8_ = local_628.data;
              opt_b.workspace_allocator = (Allocator *)local_628.elemsize;
              opt_b._28_36_ = OVar14._28_36_;
              opt_b.openmp_blocktime = local_628.elempack;
              opt_b._32_8_ = local_628.allocator;
              opt_b.use_subgroup_shuffle = (bool)(undefined1)local_628.w;
              opt_b.use_image_storage = (bool)local_628.w._1_1_;
              opt_b.use_tensor_storage = (bool)local_628.w._2_1_;
              opt_b.use_reserved_0 = (bool)local_628.w._3_1_;
              opt_b.use_shader_pack8 = (bool)(undefined1)local_628.dims;
              opt_b.use_subgroup_basic = (bool)local_628.dims._1_1_;
              opt_b.use_subgroup_vote = (bool)local_628.dims._2_1_;
              opt_b.use_subgroup_ballot = (bool)local_628.dims._3_1_;
              opt_b.use_local_pool_allocator = (bool)(undefined1)local_628.d;
              opt_b.use_shader_local_memory = (bool)local_628.d._1_1_;
              opt_b.use_cooperative_matrix = (bool)local_628.d._2_1_;
              opt_b.use_winograd23_convolution = (bool)local_628.d._3_1_;
              opt_b.flush_denormals = local_628.h;
              opt_b.use_winograd43_convolution = (bool)(undefined1)local_628.c;
              opt_b.use_winograd63_convolution = (bool)local_628.c._1_1_;
              opt_b.use_a53_a55_optimized_kernel = (bool)local_628.c._2_1_;
              opt_b.use_reserved_7 = (bool)local_628.c._3_1_;
              opt_b = (Option)CONCAT460(uVar15,opt_b._0_60_);
              pvVar38 = local_628.data;
              pAVar64 = (Allocator *)local_628.elemsize;
              sVar78 = local_628.cstep;
            }
            else {
              Mat::create((Mat *)&opt_b,iVar80,(int)local_648,iVar83,4,1,opt->workspace_allocator);
              sVar78 = 0;
              pvVar38 = (void *)opt_b._0_8_;
              pAVar64 = opt_b.workspace_allocator;
            }
            auVar109 = _d1;
            uVar48 = 0;
            uVar20 = (ulong)(uint)iVar83;
            if (iVar83 < 1) {
              uVar20 = uVar48;
            }
            local_3f8[0] = 0;
            local_3f8[1] = 0;
            local_3f8[2] = 0;
            local_3f8[3] = 0;
            lVar51 = (long)(int)(uVar55 * 6) * 4;
            local_648 = (void *)((long)d1 + (long)(int)(uVar55 * 3) * 4);
            local_638[0] = d1[0];
            local_638[1] = d1[1];
            local_638[2] = d1[2];
            local_638[3] = d1[3];
            local_538 = (short  [4])((long)pvVar38 + 0xc);
            local_410 = (short  [4])(sVar78 * (long)pAVar64);
            local_408 = (short  [4])((long)pAVar64 * 4);
            for (; uVar48 != uVar20; uVar48 = uVar48 + 1) {
              local_6b8 = (int *)local_538;
              asVar32[0] = 0;
              asVar32[1] = 0;
              asVar32[2] = 0;
              asVar32[3] = 0;
              local_530 = uVar48;
              for (; asVar32 != local_630; asVar32 = (short  [4])((long)asVar32 + 1)) {
                lVar81 = (long)((local_640._0_4_ * asVar32._0_4_) / 6);
                asVar31[0] = 0;
                asVar31[1] = 0;
                asVar31[2] = 0;
                asVar31[3] = 0;
                asVar34 = d1;
                lVar28 = (long)d1 + (long)(int)(uVar55 * 5) * 4;
                lVar49 = (long)d1 + (long)(int)(uVar55 * 4) * 4;
                piVar60 = local_6b8;
                sVar66 = (size_t)local_648;
                lVar71 = (long)d1 + (long)(int)(uVar55 * 2) * 4;
                lVar98 = (long)d1 + lVar68 * 4;
                for (; asVar31 != asVar93; asVar31 = (short  [4])((long)asVar31 + 1)) {
                  asVar44 = asVar34;
                  lVar41 = lVar28;
                  lVar45 = lVar49;
                  sVar65 = sVar66;
                  lVar87 = lVar71;
                  lVar97 = lVar98;
                  for (lVar52 = -5; OVar14 = opt_q, lVar52 != 0; lVar52 = lVar52 + 1) {
                    iVar19 = *(int *)(lVar97 + lVar81 * 4);
                    iVar47 = *(int *)(lVar87 + lVar81 * 4);
                    iVar67 = iVar47 + iVar19;
                    iVar19 = iVar19 - iVar47;
                    iVar83 = *(int *)(sVar65 + lVar81 * 4);
                    iVar25 = *(int *)(lVar45 + lVar81 * 4);
                    iVar47 = iVar25 + iVar83;
                    iVar83 = iVar83 - iVar25;
                    *(int *)((long)&opt_q.workspace_allocator + lVar52 * 4 + 4) =
                         iVar67 + *(int *)((long)asVar44 + lVar81 * 4) + iVar47;
                    *(int *)(&opt_q.use_subgroup_shuffle + lVar52 * 4) = iVar19 + iVar83 * 2;
                    aiStack_390[lVar52 + -1] = iVar67 + iVar47 * 4;
                    *(int *)(auStack_378 + lVar52 * 4 + -4) =
                         iVar19 + iVar83 * 8 + *(int *)(lVar41 + lVar81 * 4) * 4;
                    asVar44 = (short  [4])((long)asVar44 + lVar51);
                    lVar97 = lVar97 + lVar51;
                    lVar87 = lVar87 + lVar51;
                    sVar65 = sVar65 + lVar51;
                    lVar45 = lVar45 + lVar51;
                    lVar41 = lVar41 + lVar51;
                  }
                  iVar67 = *(int *)(sVar65 + lVar81 * 4);
                  iVar47 = *(int *)(lVar45 + lVar81 * 4);
                  iVar25 = iVar67 - iVar47;
                  iVar19 = *(int *)(lVar97 + lVar81 * 4);
                  iVar83 = *(int *)(lVar87 + lVar81 * 4);
                  iVar89 = iVar19 - iVar83;
                  opt_q.workspace_allocator._4_4_ =
                       (iVar83 + iVar19 + iVar47 + iVar67 + *(int *)((long)asVar44 + lVar81 * 4)) *
                       4;
                  OVar17 = opt_q;
                  opt_q._48_16_ = OVar14._48_16_;
                  opt_q._0_44_ = OVar17._0_44_;
                  opt_q._44_4_ = iVar25 * 8 + iVar89 * 4;
                  local_388._12_4_ =
                       *(int *)(lVar41 + lVar81 * 4) * 0x10 + iVar25 * 0x20 + iVar89 * 4;
                  piVar53 = piVar60;
                  for (lVar52 = 0x14; lVar52 != 0x74; lVar52 = lVar52 + 0x18) {
                    iVar19 = *(int *)((long)aiStack_3e8 + lVar52 + 4);
                    iVar67 = iVar19 + *(int *)((long)aiStack_3e8 + lVar52);
                    iVar19 = *(int *)((long)aiStack_3e8 + lVar52) - iVar19;
                    iVar83 = *(int *)((long)aiStack_3e8 + lVar52 + 8);
                    iVar25 = *(int *)((long)aiStack_3e8 + lVar52 + 0xc);
                    iVar47 = iVar25 + iVar83;
                    iVar83 = iVar83 - iVar25;
                    piVar53[-3] = (*(int *)((long)aiStack_3e8 + lVar52 + -4) + iVar67 + iVar47) /
                                  0x240;
                    piVar53[-2] = (iVar19 + iVar83 * 2) / 0x240;
                    piVar53[-1] = (iVar67 + iVar47 * 4) / 0x240;
                    *piVar53 = (iVar19 + iVar83 * 8 + *(int *)(&opt_q.lightmode + lVar52)) / 0x240;
                    piVar53 = piVar53 + iVar80;
                  }
                  asVar34 = (short  [4])((long)asVar34 + 4);
                  lVar98 = lVar98 + 4;
                  lVar71 = lVar71 + 4;
                  sVar66 = sVar66 + 4;
                  lVar49 = lVar49 + 4;
                  lVar28 = lVar28 + 4;
                  piVar60 = piVar60 + 4;
                }
                local_6b8 = (int *)((long)local_6b8 + (long)(int)opt_b._44_4_ * (long)pAVar64 * 4);
                uVar48 = local_530;
              }
              local_538 = (short  [4])((long)local_538 + sVar78 * (long)pAVar64);
            }
            _d1 = auVar109;
            copy_cut_border((Mat *)&opt_b,&local_628,0,opt_b.flush_denormals - local_628.h,0,
                            opt_b._44_4_ - local_628.w,opt);
            if (opt_b.blob_allocator != (Allocator *)0x0) {
              LOCK();
              *(int *)&(opt_b.blob_allocator)->_vptr_Allocator =
                   *(int *)&(opt_b.blob_allocator)->_vptr_Allocator + -1;
              UNLOCK();
              if (*(int *)&(opt_b.blob_allocator)->_vptr_Allocator == 0) {
                if (opt_b._32_8_ == 0) {
                  free((void *)opt_b._0_8_);
                }
                else {
                  (**(code **)(*(long *)opt_b._32_8_ + 0x18))();
                }
              }
            }
            if (piStack_500 != (int *)0x0) {
              LOCK();
              *piStack_500 = *piStack_500 + -1;
              UNLOCK();
              if (*piStack_500 == 0) {
                if (pAStack_4e8 == (Allocator *)0x0) {
                  free((void *)d1);
                }
                else {
                  (*pAStack_4e8->_vptr_Allocator[3])();
                }
              }
            }
            piVar60 = (int *)CONCAT44(local_588.refcount._4_4_,local_588.refcount._0_4_);
            if (piVar60 != (int *)0x0) {
              LOCK();
              *piVar60 = *piVar60 + -1;
              UNLOCK();
              if (*piVar60 == 0) {
                pvVar38 = local_588.data;
                if (local_588.allocator == (Allocator *)0x0) {
LAB_001cfc4a:
                  free(pvVar38);
                }
                else {
                  (*(local_588.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            uVar91 = *(uint *)(p_Var5 + 0x30 + (long)&(this->weight_winograd23_data).data);
            iVar67 = *(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data);
            iVar47 = *(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data);
            iVar25 = *(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data);
            iVar89 = *(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data);
            lVar51 = (long)local_628.w;
            uVar85 = uVar91 * uVar33;
            if (opt->use_sgemm_convolution == true) {
              opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
              opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
              opt_q = (Option)CONCAT460(uVar15,opt_q._0_60_);
              Mat::create((Mat *)&opt_q,local_628.h * local_628.w,uVar85,local_698.c,8,8,
                          opt->workspace_allocator);
              uVar48 = 0;
              uVar85 = iVar80;
              if (iVar80 < 1) {
                uVar85 = 0;
              }
              if ((int)uVar55 < 1) {
                uVar55 = 0;
              }
              if ((int)uVar33 < 1) {
                uVar20 = uVar48;
              }
              uVar22 = (ulong)uVar91;
              if ((int)uVar91 < 1) {
                uVar22 = uVar48;
              }
              uVar63 = (ulong)uVar54;
              if ((int)uVar54 < 1) {
                uVar63 = uVar48;
              }
              for (; uVar48 != uVar63; uVar48 = uVar48 + 1) {
                puVar42 = (undefined8 *)opt_q._0_8_;
                for (uVar86 = 0; uVar86 != uVar22; uVar86 = uVar86 + 1) {
                  for (uVar35 = 0; uVar35 != uVar20; uVar35 = uVar35 + 1) {
                    puVar56 = (undefined8 *)
                              ((long)local_698.data +
                              uVar35 * (long)iVar67 * 8 +
                              local_698.elemsize * (long)local_698.w * (long)iVar47 * uVar86 +
                              local_698.cstep * uVar48 * local_698.elemsize);
                    for (uVar54 = 0; uVar91 = uVar85, uVar54 != uVar55; uVar54 = uVar54 + 1) {
                      while (uVar91 != 0) {
                        *puVar42 = *puVar56;
                        puVar42 = puVar42 + 1;
                        puVar56 = puVar56 + iVar25;
                        uVar91 = uVar91 - 1;
                      }
                      puVar56 = puVar56 + ((long)(iVar19 * iVar89) - (long)(iVar25 * iVar80));
                    }
                  }
                }
              }
              im2col_sgemm_pack8to1_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
              if (opt_q.blob_allocator != (Allocator *)0x0) {
                LOCK();
                *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
                     *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
                UNLOCK();
                if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
                  pvVar38 = (void *)opt_q._0_8_;
                  if (opt_q._32_8_ == 0) goto LAB_001cfc4a;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
            }
            else {
              uVar48 = (ulong)(uint)local_628.c;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar85,
                         (allocator_type *)&local_588);
              uVar24 = 0;
              if ((int)uVar33 < 1) {
                uVar20 = 0;
              }
              if ((int)uVar91 < 1) {
                uVar91 = uVar24;
              }
              iVar46 = 0;
              uVar22 = uVar20;
              iVar92 = 0;
              for (; uVar24 != uVar91; uVar24 = uVar24 + 1) {
                for (lVar68 = (long)iVar92; (int)uVar22 != lVar68; lVar68 = lVar68 + 1) {
                  *(int *)(opt_q._0_8_ + lVar68 * 4) = iVar46;
                  iVar46 = iVar46 + iVar67;
                }
                iVar46 = iVar46 + (iVar19 * iVar47 - iVar67 * uVar33);
                uVar22 = (ulong)(uint)((int)uVar22 + (int)uVar20);
                iVar92 = iVar92 + (int)uVar20;
              }
              if ((int)uVar85 < 1) {
                uVar85 = 0;
              }
              uVar20 = (ulong)uVar54;
              if ((int)uVar54 < 1) {
                uVar20 = 0;
              }
              uVar22 = 0;
              if (0 < iVar80) {
                uVar22 = (ulong)(uint)iVar80;
              }
              if ((int)uVar55 < 1) {
                uVar55 = 0;
              }
              if (iVar83 < 1) {
                uVar48 = 0;
              }
              for (uVar63 = 0; uVar63 != uVar48; uVar63 = uVar63 + 1) {
                local_728 = (void *)(local_628.elemsize * local_628.cstep * uVar63 +
                                    (long)local_628.data);
                for (uVar86 = 0; uVar86 != uVar55; uVar86 = uVar86 + 1) {
                  sVar78 = (this->weight_data_tm).cstep;
                  sVar66 = (this->weight_data_tm).elemsize;
                  pvVar38 = (this->weight_data_tm).data;
                  for (uVar35 = 0; uVar35 != uVar22; uVar35 = uVar35 + 1) {
                    iVar67 = 0;
                    pvVar39 = (void *)(sVar78 * uVar63 * sVar66 + (long)pvVar38);
                    for (uVar69 = 0; uVar69 != uVar20; uVar69 = uVar69 + 1) {
                      for (uVar62 = 0; uVar85 != uVar62; uVar62 = uVar62 + 1) {
                        auVar118._8_8_ = 0;
                        auVar118._0_8_ =
                             *(ulong *)((long)local_698.data +
                                       (long)*(int *)(opt_q._0_8_ + uVar62 * 4) * 8 +
                                       local_698.cstep * local_698.elemsize * uVar69 +
                                       (long)(iVar25 * 8 * (int)uVar35) +
                                       (long)local_698.w * uVar86 * (long)iVar89 *
                                       local_698.elemsize);
                        auVar102 = vpcmpgtb_avx((undefined1  [16])0x0,auVar118);
                        auVar101 = vpunpcklbw_avx(auVar118,auVar102);
                        auVar121._8_8_ = 0;
                        auVar121._0_8_ = *(ulong *)((long)pvVar39 + uVar62 * 8);
                        auVar102 = vpcmpgtb_avx((undefined1  [16])0x0,auVar121);
                        auVar102 = vpunpcklbw_avx(auVar121,auVar102);
                        auVar116 = vpmullw_avx(auVar102,auVar101);
                        auVar102 = vpmulhw_avx(auVar101,auVar102);
                        auVar101 = vpunpcklwd_avx(auVar116,auVar102);
                        auVar102 = vpunpckhwd_avx(auVar116,auVar102);
                        auVar102 = vpaddd_avx(auVar101,auVar102);
                        auVar102 = vphaddd_avx(auVar102,auVar102);
                        auVar102 = vphaddd_avx(auVar102,auVar102);
                        iVar67 = iVar67 + auVar102._0_4_;
                      }
                      pvVar39 = (void *)((long)pvVar39 + (ulong)uVar85 * 8);
                    }
                    *(int *)((long)local_728 + uVar35 * 4) = iVar67;
                  }
                  local_728 = (void *)((long)local_728 + lVar51 * 4);
                }
              }
LAB_001ccb54:
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
            }
          }
        }
      }
      else if (iVar47 == 1 && local_640._0_4_ == 1) {
        p_Var5 = this->_vptr_Convolution_x86_avx512[-3];
        uVar33 = *(uint *)(p_Var5 + 0x2c + (long)&(this->weight_winograd23_data).data);
        uVar20 = (ulong)uVar33;
        if ((uVar33 == 1) &&
           (*(int *)(p_Var5 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)) {
          if ((*(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1) &&
             (((*(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) {
            conv1x1s1_sgemm_int8_sse(&local_698,&local_628,&this->weight_sgemm_data,opt);
          }
          else {
            if ((((*(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))
            goto LAB_001cc0a4;
            opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
            opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
            opt_q = (Option)CONCAT460(uVar15,opt_q._0_60_);
            Mat::create((Mat *)&opt_q,local_628.w,local_628.h,local_698.c,local_698.elemsize,
                        local_698.elempack,opt->workspace_allocator);
            uVar20 = 0;
            if ((int)uVar55 < 1) {
              uVar55 = 0;
            }
            uVar48 = (ulong)uVar54;
            if ((int)uVar54 < 1) {
              uVar48 = uVar20;
            }
            for (; uVar20 != uVar48; uVar20 = uVar20 + 1) {
              puVar36 = (undefined1 *)
                        (local_698.cstep * uVar20 * local_698.elemsize + (long)local_698.data);
              lVar51 = opt_q._0_8_;
              for (uVar54 = 0; uVar54 != uVar55; uVar54 = uVar54 + 1) {
                puVar61 = puVar36 + (iVar19 - iVar80) * 2;
                puVar75 = puVar36;
                for (lVar68 = 0; (int)lVar68 + 3 < iVar80; lVar68 = lVar68 + 4) {
                  *(undefined1 *)(lVar51 + lVar68) = *puVar75;
                  *(undefined1 *)(lVar51 + 1 + lVar68) = puVar75[2];
                  *(undefined1 *)(lVar51 + 2 + lVar68) = puVar75[4];
                  *(undefined1 *)(lVar51 + 3 + lVar68) = puVar75[6];
                  puVar75 = puVar75 + 8;
                  puVar61 = puVar61 + 8;
                }
                for (; (int)lVar68 + 1 < iVar80; lVar68 = lVar68 + 2) {
                  *(undefined1 *)(lVar51 + lVar68) = *puVar75;
                  *(undefined1 *)(lVar51 + 1 + lVar68) = puVar75[2];
                  puVar75 = puVar75 + 4;
                  puVar61 = puVar61 + 4;
                }
                for (; (int)lVar68 < iVar80; lVar68 = lVar68 + 1) {
                  *(undefined1 *)(lVar51 + lVar68) = puVar36[lVar68 * 2];
                  puVar61 = puVar61 + 2;
                }
                lVar51 = lVar51 + lVar68;
                puVar36 = puVar61;
              }
            }
            conv1x1s1_sgemm_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
            if (opt_q.blob_allocator != (Allocator *)0x0) {
              LOCK();
              *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
                   *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
              UNLOCK();
              if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
                pvVar38 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) goto LAB_001cfc4a;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
LAB_001cc0a4:
          if ((((opt->use_winograd_convolution != true) || (uVar33 != 3)) ||
              ((opt->use_winograd23_convolution == false ||
               (((*(int *)(p_Var5 + 0x30 + (long)&(this->weight_winograd23_data).data) != 3 ||
                 (*(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)))))) ||
             (((*(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
              ((iVar47 * local_630._0_4_ < 0x10 ||
               (*(int *)(p_Var5 + 0x28 + (long)&(this->weight_winograd23_data).data) < 0x10)))))) {
            uVar91 = *(uint *)(p_Var5 + 0x30 + (long)&(this->weight_winograd23_data).data);
            iVar67 = *(int *)(p_Var5 + 0x34 + (long)&(this->weight_winograd23_data).data);
            iVar47 = *(int *)(p_Var5 + 0x38 + (long)&(this->weight_winograd23_data).data);
            iVar25 = *(int *)(p_Var5 + 0x3c + (long)&(this->weight_winograd23_data).data);
            lVar51 = (long)iVar25;
            iVar89 = *(int *)(p_Var5 + 0x40 + (long)&(this->weight_winograd23_data).data);
            lVar68 = (long)local_628.w;
            uVar48 = (ulong)(uint)local_628.h;
            uVar85 = uVar91 * uVar33;
            uVar22 = (ulong)uVar85;
            if (opt->use_sgemm_convolution == true) {
              opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
              opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
              opt_q = (Option)CONCAT460(uVar15,opt_q._0_60_);
              Mat::create((Mat *)&opt_q,local_628.h * local_628.w,uVar85,local_698.c,1,1,
                          opt->workspace_allocator);
              lVar68 = (long)(iVar25 * 2);
              uVar48 = 0;
              if ((int)uVar55 < 1) {
                uVar55 = 0;
              }
              if ((int)uVar33 < 1) {
                uVar20 = uVar48;
              }
              uVar22 = (ulong)uVar91;
              if ((int)uVar91 < 1) {
                uVar22 = uVar48;
              }
              uVar63 = (ulong)uVar54;
              if ((int)uVar54 < 1) {
                uVar63 = uVar48;
              }
              for (; uVar48 != uVar63; uVar48 = uVar48 + 1) {
                lVar28 = opt_q._0_8_;
                for (uVar86 = 0; uVar86 != uVar22; uVar86 = uVar86 + 1) {
                  for (uVar35 = 0; uVar35 != uVar20; uVar35 = uVar35 + 1) {
                    puVar36 = (undefined1 *)
                              ((long)local_698.data +
                              uVar35 * (long)iVar67 +
                              (long)local_698.w * local_698.elemsize * (long)iVar47 * uVar86 +
                              local_698.cstep * uVar48 * local_698.elemsize);
                    for (uVar54 = 0; uVar54 != uVar55; uVar54 = uVar54 + 1) {
                      lVar71 = 0;
                      puVar61 = puVar36;
                      for (lVar49 = 0; (int)lVar49 + 3 < iVar80; lVar49 = lVar49 + 4) {
                        *(undefined1 *)(lVar28 + lVar49) = *puVar61;
                        *(undefined1 *)(lVar28 + 1 + lVar49) = puVar61[lVar51];
                        *(undefined1 *)(lVar28 + 2 + lVar49) = puVar61[lVar68];
                        *(undefined1 *)(lVar28 + 3 + lVar49) = puVar61[iVar25 * 3];
                        puVar61 = puVar61 + iVar25 * 4;
                        lVar71 = lVar71 + iVar25 * 4;
                      }
                      for (; (int)lVar49 + 1 < iVar80; lVar49 = lVar49 + 2) {
                        *(undefined1 *)(lVar28 + lVar49) = *puVar61;
                        *(undefined1 *)(lVar28 + 1 + lVar49) = puVar61[lVar51];
                        puVar61 = puVar61 + lVar68;
                        lVar71 = lVar71 + lVar68;
                      }
                      for (; (int)lVar49 < iVar80; lVar49 = lVar49 + 1) {
                        *(undefined1 *)(lVar28 + lVar49) = puVar36[lVar71];
                        lVar71 = lVar71 + lVar51;
                      }
                      puVar36 = puVar36 + lVar71 + (iVar19 * iVar89 - iVar80 * iVar25);
                      lVar28 = lVar28 + lVar49;
                    }
                  }
                }
              }
              im2col_sgemm_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
              if (opt_q.blob_allocator != (Allocator *)0x0) {
                LOCK();
                *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
                     *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
                UNLOCK();
                if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
                  pvVar38 = (void *)opt_q._0_8_;
                  if (opt_q._32_8_ == 0) goto LAB_001cfc4a;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
              goto LAB_001ccb61;
            }
            uVar63 = (ulong)(uint)local_628.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar85,
                       (allocator_type *)&local_588);
            iVar25 = 0;
            if ((int)uVar33 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar91 < 1) {
              uVar91 = 0;
            }
            uVar86 = uVar20;
            iVar92 = 0;
            for (uVar24 = 0; uVar24 != uVar91; uVar24 = uVar24 + 1) {
              for (lVar28 = (long)iVar92; (int)uVar86 != lVar28; lVar28 = lVar28 + 1) {
                *(int *)(opt_q._0_8_ + lVar28 * 4) = iVar25;
                iVar25 = iVar25 + iVar67;
              }
              iVar25 = iVar25 + (iVar19 * iVar47 - iVar67 * uVar33);
              uVar86 = (ulong)(uint)((int)uVar86 + (int)uVar20);
              iVar92 = iVar92 + (int)uVar20;
            }
            local_630 = (short  [4])(local_628.elemsize * local_628.cstep);
            local_640._0_4_ = uVar54 * uVar85;
            if ((int)uVar85 < 1) {
              uVar22 = 0;
            }
            uVar20 = (ulong)uVar54;
            if ((int)uVar54 < 1) {
              uVar20 = 0;
            }
            uVar86 = 0;
            if (0 < iVar80) {
              uVar86 = (ulong)(uint)iVar80;
            }
            if ((int)uVar55 < 1) {
              uVar48 = 0;
            }
            if (iVar83 < 1) {
              uVar63 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar63; uVar35 = uVar35 + 1) {
              local_728 = (void *)((long)local_630 * uVar35 + (long)local_628.data);
              for (uVar69 = 0; uVar69 != uVar48; uVar69 = uVar69 + 1) {
                pvVar38 = (this->weight_data_tm).data;
                for (uVar62 = 0; uVar62 != uVar86; uVar62 = uVar62 + 1) {
                  iVar67 = 0;
                  lVar28 = (long)pvVar38 + (long)(int)(uVar54 * uVar85 * (int)uVar35);
                  for (uVar37 = 0; uVar37 != uVar20; uVar37 = uVar37 + 1) {
                    for (uVar76 = 0; uVar22 != uVar76; uVar76 = uVar76 + 1) {
                      iVar67 = iVar67 + (int)*(char *)(lVar28 + uVar76) *
                                        (int)*(char *)((long)local_698.data +
                                                      (long)*(int *)(opt_q._0_8_ + uVar76 * 4) +
                                                      local_698.cstep * local_698.elemsize * uVar37
                                                      + uVar62 * lVar51 +
                                                        (long)local_698.w * uVar69 * (long)iVar89 *
                                                        local_698.elemsize);
                    }
                    lVar28 = lVar28 + (int)uVar85;
                  }
                  *(int *)((long)local_728 + uVar62 * 4) = iVar67;
                }
                local_728 = (void *)((long)local_728 + lVar68 * 4);
              }
            }
            goto LAB_001ccb54;
          }
          lVar51 = (long)local_698.c;
          uVar20 = (ulong)local_628.c;
          piVar60 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
          opt_q.blob_allocator._4_4_ = local_698.refcount._4_4_;
          opt_q.blob_allocator._0_4_ = local_698.refcount._0_4_;
          opt_q._0_8_ = local_698.data;
          opt_q.workspace_allocator = (Allocator *)local_698.elemsize;
          opt_q.openmp_blocktime = local_698.elempack;
          opt_q._32_8_ = local_698.allocator;
          opt_q.use_subgroup_shuffle = (bool)(undefined1)local_698.w;
          opt_q.use_image_storage = (bool)local_698.w._1_1_;
          opt_q.use_tensor_storage = (bool)local_698.w._2_1_;
          opt_q.use_reserved_0 = (bool)local_698.w._3_1_;
          opt_q.use_shader_pack8 = (bool)(undefined1)local_698.dims;
          opt_q.use_subgroup_basic = (bool)local_698.dims._1_1_;
          opt_q.use_subgroup_vote = (bool)local_698.dims._2_1_;
          opt_q.use_subgroup_ballot = (bool)local_698.dims._3_1_;
          opt_q.use_local_pool_allocator = (bool)(undefined1)local_698.d;
          opt_q.use_shader_local_memory = (bool)local_698.d._1_1_;
          opt_q.use_cooperative_matrix = (bool)local_698.d._2_1_;
          opt_q.use_winograd23_convolution = (bool)local_698.d._3_1_;
          opt_q.flush_denormals = local_698.h;
          opt_q.use_winograd43_convolution = (bool)(undefined1)local_698.c;
          opt_q.use_winograd63_convolution = (bool)local_698.c._1_1_;
          opt_q.use_a53_a55_optimized_kernel = (bool)local_698.c._2_1_;
          opt_q.use_reserved_7 = (bool)local_698.c._3_1_;
          opt_q = (Option)CONCAT460(uVar15,opt_q._0_60_);
          if (piVar60 != (int *)0x0) {
            LOCK();
            *piVar60 = *piVar60 + 1;
            UNLOCK();
          }
          uVar48 = (long)(int)(local_628.w + 1) / 2;
          local_400 = uVar48 & 0xffffffff;
          uVar22 = (long)(int)(local_628.h + 1) / 2;
          iVar67 = (int)uVar22;
          aiStack_3e8[2] = iVar67 * 2;
          iVar47 = (int)uVar48 * 2 + 2;
          auVar109 = vmovdqu64_avx512f((undefined1  [64])*opt);
          auVar109 = vmovdqu64_avx512f(auVar109);
          opt_b._16_48_ = auVar109._16_48_;
          opt_b._0_8_ = auVar109._0_8_;
          opt_b.blob_allocator = opt->workspace_allocator;
          copy_make_border(&local_698,(Mat *)&opt_q,0,(aiStack_3e8[2] - local_698.h) + 2,0,
                           iVar47 - local_698.w,0,0.0,&opt_b);
          local_588.cstep = 0;
          uVar85 = iVar67 * (int)local_400;
          local_588.data = (void *)0x0;
          local_588.refcount._0_4_ = 0;
          local_588.refcount._4_4_ = 0;
          local_588.elemsize = 0;
          local_588.elempack = 0;
          local_588.allocator = (Allocator *)0x0;
          local_588.dims = 0;
          local_588.w = 0;
          local_588.h = 0;
          local_588.d = 0;
          local_588.c = 0;
          Mat::create(&local_588,0x10,uVar85,uVar54,2,opt->workspace_allocator);
          pvVar38 = local_588.data;
          uVar55 = (uint)local_400;
          aiStack_3e8[1] = uVar55 * 2;
          lVar68 = (long)opt_q.workspace_allocator * sVar78;
          lVar28 = local_588.elemsize * local_588.cstep;
          uVar16 = opt_q._0_8_;
          lVar49 = (long)iVar47;
          uVar48 = 0;
          uVar33 = 0;
          if (0 < (int)uVar55) {
            uVar33 = uVar55;
          }
          uVar22 = uVar22 & 0xffffffff;
          if (iVar67 < 1) {
            uVar22 = uVar48;
          }
          uVar63 = 0;
          if (0 < (int)uVar54) {
            uVar63 = (ulong)uVar54;
          }
          for (; uVar48 != uVar63; uVar48 = uVar48 + 1) {
            pvVar39 = (void *)(lVar28 * uVar48 + (long)pvVar38);
            for (uVar86 = 0; uVar86 != uVar22; uVar86 = uVar86 + 1) {
              lVar52 = (long)(iVar47 * 2 * (int)uVar86) + lVar68 * uVar48 + uVar16;
              lVar71 = lVar52 + lVar49;
              lVar98 = lVar49 + lVar71;
              lVar81 = lVar98 + lVar49;
              for (uVar55 = 0; uVar55 != uVar33; uVar55 = uVar55 + 1) {
                for (lVar41 = 0; lVar41 != 4; lVar41 = lVar41 + 1) {
                  d0[lVar41] = (short)*(char *)(lVar52 + lVar41);
                  d1[lVar41] = (short)*(char *)(lVar71 + lVar41);
                  d2[lVar41] = (short)*(char *)(lVar98 + lVar41);
                  d3[lVar41] = (short)*(char *)(lVar81 + lVar41);
                }
                for (lVar41 = 0; lVar41 != 8; lVar41 = lVar41 + 2) {
                  sVar3 = *(short *)((long)d2 + lVar41);
                  *(short *)((long)w0 + lVar41) = *(short *)((long)d0 + lVar41) - sVar3;
                  sVar4 = *(short *)((long)d1 + lVar41);
                  *(short *)((long)w1 + lVar41) = sVar4 + sVar3;
                  *(short *)((long)w2 + lVar41) = sVar3 - sVar4;
                  *(short *)((long)w3 + lVar41) = *(short *)((long)d3 + lVar41) - sVar4;
                }
                t0[1] = w1[0];
                t0[0] = w0[0];
                t1[1] = w1[1];
                t1[0] = w0[1];
                t2[1] = w1[2];
                t2[0] = w0[2];
                t3[1] = w1[3];
                t3[0] = w0[3];
                t0[2] = (short)w2._0_4_;
                t0[3] = w3[0];
                t1[3] = w3[1];
                t1[2] = w2[1];
                t2[2] = (short)w2._4_4_;
                t2[3] = w3[2];
                t3[3] = w3[3];
                t3[2] = w2[3];
                for (lVar41 = 0; lVar41 != 8; lVar41 = lVar41 + 2) {
                  sVar3 = *(short *)((long)t2 + lVar41);
                  *(short *)((long)d0 + lVar41) = *(short *)((long)t0 + lVar41) - sVar3;
                  sVar4 = *(short *)((long)t1 + lVar41);
                  *(short *)((long)d1 + lVar41) = sVar4 + sVar3;
                  *(short *)((long)d2 + lVar41) = sVar3 - sVar4;
                  *(short *)((long)d3 + lVar41) = *(short *)((long)t3 + lVar41) - sVar4;
                }
                for (lVar41 = 0; lVar41 != 8; lVar41 = lVar41 + 2) {
                  *(undefined2 *)((long)pvVar39 + lVar41) = *(undefined2 *)((long)d0 + lVar41);
                  *(undefined2 *)((long)pvVar39 + lVar41 + 8) = *(undefined2 *)((long)d1 + lVar41);
                  *(undefined2 *)((long)pvVar39 + lVar41 + 0x10) =
                       *(undefined2 *)((long)d2 + lVar41);
                  *(undefined2 *)((long)pvVar39 + lVar41 + 0x18) =
                       *(undefined2 *)((long)d3 + lVar41);
                }
                lVar52 = lVar52 + 2;
                lVar71 = lVar71 + 2;
                lVar98 = lVar98 + 2;
                lVar81 = lVar81 + 2;
                pvVar39 = (void *)((long)pvVar39 + 0x20);
              }
            }
          }
          if (opt_q.blob_allocator != (Allocator *)0x0) {
            LOCK();
            *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
                 *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
            UNLOCK();
            if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
              if (opt_q._32_8_ == 0) {
                free((void *)opt_q._0_8_);
              }
              else {
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
          opt_q._0_12_ = SUB1612((undefined1  [16])0x0,0);
          opt_q._0_28_ = ZEXT1228((undefined1  [12])opt_q._0_12_);
          OVar14 = opt_q;
          opt_q._0_44_ = OVar14._0_44_;
          opt_q._0_60_ = ZEXT4460((undefined1  [44])opt_q._0_44_);
          opt_q._0_32_ = OVar14._0_32_;
          opt_q._0_48_ = ZEXT3248((undefined1  [32])opt_q._0_32_);
          d0[0] = 0;
          d0[1] = 0;
          d0[2] = 0;
          d0[3] = 0;
          Mat::create((Mat *)d0,0x10,uVar85,iVar83,4,opt->workspace_allocator);
          sVar78 = (this->weight_winograd23_data).elemsize;
          lVar68 = (this->weight_winograd23_data).cstep * sVar78;
          uVar63 = 0;
          uVar48 = (ulong)uVar85;
          if ((int)uVar85 < 1) {
            uVar48 = uVar63;
          }
          local_6a0 = (this->weight_winograd23_data).data;
          uVar86 = (ulong)uVar91;
          if ((int)uVar91 < 1) {
            uVar86 = uVar63;
          }
          lVar28 = lVar68 * 4;
          local_468 = (void *)(lVar68 * 3 + (long)local_6a0);
          local_648 = (void *)((long)local_6a0 + lVar68 * 2);
          local_410[0] = d0[0];
          local_410[1] = d0[1];
          local_410[2] = d0[2];
          local_410[3] = d0[3];
          local_538[0] = d0[0];
          local_538[1] = d0[1];
          local_538[2] = d0[2];
          local_538[3] = d0[3];
          local_408[0] = d0[0];
          local_408[1] = d0[1];
          local_408[2] = d0[2];
          local_408[3] = d0[3];
          auVar109 = ZEXT1664((undefined1  [16])0x0);
          local_448 = (void *)((long)local_6a0 + lVar68);
          for (; uVar63 != uVar86; uVar63 = uVar63 + 1) {
            lVar49 = (long)(this->weight_winograd23_data).w;
            local_530 = 0;
            lVar71 = sVar78 * lVar49;
            lVar49 = lVar49 * sVar78 * 4;
            local_3f8[0] = d0[0];
            local_3f8[1] = d0[1];
            local_3f8[2] = d0[2];
            local_3f8[3] = d0[3];
            for (uVar35 = 0; uVar35 != uVar48; uVar35 = uVar35 + 1) {
              _d1 = vmovdqu64_avx512f(auVar109);
              _d2 = vmovdqu64_avx512f(auVar109);
              _d3 = vmovdqu64_avx512f(auVar109);
              _w0 = vmovdqu64_avx512f(auVar109);
              local_638 = (short  [4])(local_588.elemsize * local_588.cstep);
              lVar81 = (long)local_588.w * uVar35;
              pvVar79 = (void *)((local_588.cstep * 3 + lVar81) * local_588.elemsize +
                                (long)local_588.data);
              lVar98 = (long)local_638 * 4;
              pvVar82 = (void *)((lVar81 + local_588.cstep * 2) * local_588.elemsize +
                                (long)local_588.data);
              pvVar99 = (void *)((local_588.cstep + lVar81) * local_588.elemsize +
                                (long)local_588.data);
              pvVar74 = (void *)(lVar81 * local_588.elemsize + (long)local_588.data);
              local_710 = local_648;
              pvVar38 = local_448;
              pvVar39 = local_468;
              pvVar88 = local_6a0;
              for (uVar69 = 0; (long)(uVar69 | 3) < lVar51; uVar69 = uVar69 + 4) {
                for (lVar81 = 0; lVar81 != 0x20; lVar81 = lVar81 + 2) {
                  iVar80 = (int)*(short *)((long)pvVar74 + lVar81);
                  iVar67 = (int)*(short *)((long)pvVar99 + lVar81);
                  iVar47 = (int)*(short *)((long)pvVar82 + lVar81);
                  iVar19 = (int)*(short *)((long)pvVar79 + lVar81);
                  *(int *)(d1 + lVar81) =
                       *(short *)((long)pvVar88 + lVar81 + 0x60) * iVar19 +
                       *(short *)((long)pvVar88 + lVar81 + 0x40) * iVar47 +
                       *(short *)((long)pvVar88 + lVar81 + 0x20) * iVar67 +
                       *(short *)((long)pvVar88 + lVar81) * iVar80 + *(int *)(d1 + lVar81);
                  lVar52 = lVar68 + lVar81;
                  *(int *)(d2 + lVar81) =
                       *(short *)((long)pvVar88 + lVar68 + 0x60 + lVar81) * iVar19 +
                       *(short *)((long)pvVar88 + lVar68 + 0x40 + lVar81) * iVar47 +
                       *(short *)((long)pvVar88 + lVar68 + 0x20 + lVar81) * iVar67 +
                       *(short *)((long)pvVar88 + lVar68 + lVar81) * iVar80 + *(int *)(d2 + lVar81);
                  lVar41 = lVar68 + lVar52;
                  *(int *)(d3 + lVar81) =
                       *(short *)((long)pvVar88 + lVar68 + 0x60 + lVar52) * iVar19 +
                       *(short *)((long)pvVar88 + lVar68 + 0x40 + lVar52) * iVar47 +
                       *(short *)((long)pvVar88 + lVar68 + 0x20 + lVar52) * iVar67 +
                       *(short *)((long)pvVar88 + lVar68 + lVar52) * iVar80 + *(int *)(d3 + lVar81);
                  *(int *)(w0 + lVar81) =
                       *(short *)((long)pvVar88 + lVar68 + 0x60 + lVar41) * iVar19 +
                       *(short *)((long)pvVar88 + lVar68 + 0x40 + lVar41) * iVar47 +
                       *(short *)((long)pvVar88 + lVar68 + 0x20 + lVar41) * iVar67 +
                       *(short *)((long)pvVar88 + lVar68 + lVar41) * iVar80 + *(int *)(w0 + lVar81);
                }
                pvVar79 = (void *)((long)pvVar79 + lVar98);
                pvVar82 = (void *)((long)pvVar82 + lVar98);
                pvVar99 = (void *)((long)pvVar99 + lVar98);
                pvVar88 = (void *)((long)pvVar88 + lVar49);
                pvVar74 = (void *)((long)pvVar74 + lVar98);
                pvVar39 = (void *)((long)pvVar39 + lVar49);
                local_710 = (void *)((long)local_710 + lVar49);
                pvVar38 = (void *)((long)pvVar38 + lVar49);
              }
              for (; (long)uVar69 < lVar51; uVar69 = uVar69 + 1) {
                for (lVar98 = 0; lVar98 != 0x20; lVar98 = lVar98 + 2) {
                  iVar67 = (int)*(short *)((long)pvVar74 + lVar98);
                  *(int *)(d1 + lVar98) =
                       *(int *)(d1 + lVar98) + *(short *)((long)pvVar88 + lVar98) * iVar67;
                  *(int *)(d2 + lVar98) =
                       *(int *)(d2 + lVar98) + *(short *)((long)pvVar38 + lVar98) * iVar67;
                  *(int *)(d3 + lVar98) =
                       *(int *)(d3 + lVar98) + *(short *)((long)local_710 + lVar98) * iVar67;
                  *(int *)(w0 + lVar98) =
                       *(int *)(w0 + lVar98) + *(short *)((long)pvVar39 + lVar98) * iVar67;
                }
                pvVar39 = (void *)((long)pvVar39 + lVar71);
                local_710 = (void *)((long)local_710 + lVar71);
                pvVar38 = (void *)((long)pvVar38 + lVar71);
                pvVar88 = (void *)((long)pvVar88 + lVar71);
                pvVar74 = (void *)((long)pvVar74 + (long)local_638);
              }
              for (lVar98 = 0; lVar98 != 0x40; lVar98 = lVar98 + 4) {
                *(undefined4 *)((long)local_538 + lVar98) = *(undefined4 *)((long)d1 + lVar98);
                *(undefined4 *)((long)local_408 + lVar98) = *(undefined4 *)((long)d2 + lVar98);
                *(undefined4 *)((long)local_410 + lVar98) = *(undefined4 *)((long)d3 + lVar98);
                *(undefined4 *)((long)d0 + lVar98) = *(undefined4 *)((long)w0 + lVar98);
              }
              local_640 = d0;
              local_630 = local_410;
            }
            local_6a0 = (void *)((long)local_6a0 + lVar28);
            local_468 = (void *)((long)local_468 + lVar28);
            local_648 = (void *)((long)local_648 + lVar28);
            local_448 = (void *)((long)local_448 + lVar28);
          }
          uVar63 = uVar20 & 0xfffffffffffffffc;
          local_648 = (void *)(this->weight_winograd23_data).elemsize;
          lVar68 = (this->weight_winograd23_data).cstep * (long)local_648;
          local_718 = (void *)(lVar68 * uVar63 + (long)(this->weight_winograd23_data).data);
          local_530 = (long)local_648 * 4;
          local_538 = (short  [4])0x0;
          for (; (long)uVar63 < (long)uVar20; uVar63 = uVar63 + 1) {
            lVar28 = (long)(this->weight_winograd23_data).w;
            local_640 = (short  [4])((long)local_648 * lVar28);
            lVar49 = (long)local_648 * 4 * lVar28;
            local_630 = (short  [4])(lVar28 * (long)local_648 * 2 + (long)local_718);
            local_638 = (short  [4])((long)local_718 + (long)local_640);
            for (uVar86 = 0; uVar86 != uVar48; uVar86 = uVar86 + 1) {
              _d1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
              lVar98 = (long)local_588.w * uVar86;
              pvVar79 = (void *)((local_588.cstep * 3 + lVar98) * local_588.elemsize +
                                (long)local_588.data);
              lVar71 = local_588.elemsize * local_588.cstep * 4;
              pvVar88 = (void *)((lVar98 + local_588.cstep * 2) * local_588.elemsize +
                                (long)local_588.data);
              pvVar82 = (void *)((local_588.cstep + lVar98) * local_588.elemsize +
                                (long)local_588.data);
              pvVar74 = (void *)(lVar98 * local_588.elemsize + (long)local_588.data);
              pvVar38 = local_718;
              asVar93 = local_638;
              pvVar39 = (void *)((long)local_648 * 3 * lVar28 + (long)local_718);
              asVar34 = local_630;
              for (uVar35 = 0; (long)(uVar35 | 3) < lVar51; uVar35 = uVar35 + 4) {
                for (lVar98 = 0; lVar98 != 0x20; lVar98 = lVar98 + 2) {
                  *(int *)(d1 + lVar98) =
                       (int)*(short *)((long)pvVar39 + lVar98) *
                       (int)*(short *)((long)pvVar79 + lVar98) +
                       (int)*(short *)((long)asVar34 + lVar98) *
                       (int)*(short *)((long)pvVar88 + lVar98) +
                       (int)*(short *)((long)asVar93 + lVar98) *
                       (int)*(short *)((long)pvVar82 + lVar98) +
                       (int)*(short *)((long)pvVar38 + lVar98) *
                       (int)*(short *)((long)pvVar74 + lVar98) + *(int *)(d1 + lVar98);
                }
                pvVar39 = (void *)((long)pvVar39 + lVar49);
                pvVar79 = (void *)((long)pvVar79 + lVar71);
                asVar34 = (short  [4])((long)asVar34 + lVar49);
                pvVar88 = (void *)((long)pvVar88 + lVar71);
                asVar93 = (short  [4])((long)asVar93 + lVar49);
                pvVar82 = (void *)((long)pvVar82 + lVar71);
                pvVar38 = (void *)((long)pvVar38 + lVar49);
                pvVar74 = (void *)((long)pvVar74 + lVar71);
              }
              for (; (long)uVar35 < lVar51; uVar35 = uVar35 + 1) {
                for (lVar71 = 0; lVar71 != 0x10; lVar71 = lVar71 + 1) {
                  *(int *)(d1 + lVar71 * 2) =
                       *(int *)(d1 + lVar71 * 2) +
                       (int)*(short *)((long)pvVar38 + lVar71 * 2) *
                       (int)*(short *)((long)pvVar74 + lVar71 * 2);
                }
                pvVar38 = (void *)((long)pvVar38 + (long)local_640);
                pvVar74 = (void *)((long)pvVar74 + local_588.elemsize * local_588.cstep);
              }
              for (lVar71 = 0; lVar71 != 0x10; lVar71 = lVar71 + 1) {
                *(undefined4 *)((long)d0 + lVar71 * 4) = *(undefined4 *)(d1 + lVar71 * 2);
              }
            }
            local_718 = (void *)((long)local_718 + lVar68);
          }
          piVar60 = (int *)CONCAT44(local_588.refcount._4_4_,local_588.refcount._0_4_);
          if (piVar60 != (int *)0x0) {
            LOCK();
            *piVar60 = *piVar60 + -1;
            UNLOCK();
            if (*piVar60 == 0) {
              if (local_588.allocator == (Allocator *)0x0) {
                free(local_588.data);
              }
              else {
                (*(local_588.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          auVar13 = auStack_4ec;
          local_588.cstep = 0;
          local_588.data = (void *)0x0;
          local_588.refcount._0_4_ = 0;
          local_588.refcount._4_4_ = 0;
          local_588.elemsize = 0;
          local_588.elempack = 0;
          local_588.h = 0;
          local_588.d = 0;
          local_588.c = 0;
          local_588.allocator = (Allocator *)0x0;
          local_588.dims = 0;
          local_588.w = 0;
          _d1 = SUB1612((undefined1  [16])0x0,0);
          _d1 = ZEXT1228(_d1);
          auStack_4ec._32_4_ = auVar13._32_4_;
          _d1 = ZEXT3260(_d1);
          Mat::create((Mat *)d1,aiStack_3e8[1],aiStack_3e8[2],iVar83,4,opt->workspace_allocator);
          uVar48 = 0;
          uVar20 = (ulong)(uint)iVar83;
          if (iVar83 < 1) {
            uVar20 = uVar48;
          }
          for (; uVar48 != uVar20; uVar48 = uVar48 + 1) {
            for (uVar63 = 0; uVar63 != uVar22; uVar63 = uVar63 + 1) {
              puVar42 = (undefined8 *)(uVar63 * 2 * (long)iStack_4dc * sStack_4f8 + (long)d1);
              puVar56 = (undefined8 *)((uVar63 * 2 + 1) * (long)iStack_4dc * sStack_4f8 + (long)d1);
              for (uVar86 = 0; uVar86 != uVar33; uVar86 = uVar86 + 1) {
                for (lVar51 = 0; lVar51 != 0x10; lVar51 = lVar51 + 4) {
                  *(undefined4 *)((long)d2 + lVar51) = *(undefined4 *)((long)d0 + lVar51);
                  *(undefined4 *)((long)d3 + lVar51) = *(undefined4 *)((long)d0 + 0x10 + lVar51);
                  *(undefined4 *)((long)w0 + lVar51) = *(undefined4 *)((long)d0 + 0x20 + lVar51);
                  *(undefined4 *)((long)w1 + lVar51) = *(undefined4 *)((long)d0 + 0x30 + lVar51);
                }
                for (lVar51 = 0; lVar51 != 0x10; lVar51 = lVar51 + 4) {
                  *(int *)((long)w2 + lVar51) =
                       *(int *)((long)d2 + lVar51) + *(int *)((long)d3 + lVar51) +
                       *(int *)((long)w0 + lVar51);
                  *(int *)((long)w3 + lVar51) =
                       (*(int *)((long)d3 + lVar51) - *(int *)((long)w0 + lVar51)) +
                       *(int *)((long)w1 + lVar51);
                }
                t0[0] = w2[0];
                t0[1] = w2[1];
                t0[2] = w3[0];
                t0[3] = w3[1];
                t1[0] = w2[2];
                t1[1] = w2[3];
                t1[2] = w3[2];
                t1[3] = w3[3];
                t2._0_4_ = local_420;
                t2._4_4_ = local_430;
                t3._0_4_ = local_41c;
                t3._4_4_ = local_42c;
                for (lVar51 = 0; lVar51 != 8; lVar51 = lVar51 + 4) {
                  *(int *)((long)o0 + lVar51) =
                       *(int *)((long)t0 + lVar51) + *(int *)((long)t1 + lVar51) +
                       *(int *)((long)t2 + lVar51);
                  *(int *)((long)o0 + lVar51 + -8) =
                       (*(int *)((long)t1 + lVar51) - *(int *)((long)t2 + lVar51)) +
                       *(int *)((long)t3 + lVar51);
                }
                auVar114._8_8_ = 0;
                auVar114._0_4_ = o0[0];
                auVar114._4_4_ = o0[1];
                auVar102 = vpsrad_avx(auVar114,2);
                *puVar42 = auVar102._0_8_;
                auVar115._8_8_ = 0;
                auVar115._0_8_ = local_158;
                auVar102 = vpsrad_avx(auVar115,2);
                *puVar56 = auVar102._0_8_;
                puVar42 = puVar42 + 1;
                puVar56 = puVar56 + 1;
              }
            }
          }
          copy_cut_border((Mat *)d1,&local_628,0,iStack_4d8 - local_628.h,0,iStack_4dc - local_628.w
                          ,opt);
          if (piStack_500 != (int *)0x0) {
            LOCK();
            *piStack_500 = *piStack_500 + -1;
            UNLOCK();
            if (*piStack_500 == 0) {
              if (pAStack_4e8 == (Allocator *)0x0) {
                free((void *)d1);
              }
              else {
                (*pAStack_4e8->_vptr_Allocator[3])();
              }
            }
          }
          piVar60 = (int *)CONCAT44(local_588.refcount._4_4_,local_588.refcount._0_4_);
          if (piVar60 != (int *)0x0) {
            LOCK();
            *piVar60 = *piVar60 + -1;
            UNLOCK();
            if (*piVar60 == 0) {
              if (local_588.allocator == (Allocator *)0x0) {
                free(local_588.data);
              }
              else {
                (*(local_588.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (opt_q.blob_allocator != (Allocator *)0x0) {
            LOCK();
            *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
                 *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
            UNLOCK();
            if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
              pvVar38 = (void *)opt_q._0_8_;
              if (opt_q._32_8_ == 0) goto LAB_001cfc4a;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
    }
LAB_001ccb61:
    p_Var5 = this->_vptr_Convolution_x86_avx512[-3];
    if (aiStack_3e8[3] < 0x65) {
      dequantize_from_int32
                (&local_628,local_3f0,&this->scale_in_data,
                 (Mat *)(p_Var5 + 0x18 + (long)&(this->scale_in_data).data),opt);
      pLVar6 = this->activation;
      iVar67 = 0;
      if (pLVar6 != (Layer *)0x0) {
        (*pLVar6->_vptr_Layer[9])(pLVar6,local_3f0,opt);
      }
    }
    else {
      iVar67 = 0;
      requantize_from_int32_to_int8
                (&local_628,local_3f0,&this->scale_in_data,
                 (Mat *)(&this->field_0x280 + (long)p_Var5),
                 (Mat *)(p_Var5 + 0x18 + (long)&(this->scale_in_data).data),
                 *(int *)(p_Var5 + 0x1c + (long)&(this->weight_winograd43_data).data),
                 (Mat *)(p_Var5 + 0x20 + (long)&(this->weight_winograd43_data).data),opt);
    }
  }
  piVar60 = (int *)CONCAT44(local_628.refcount._4_4_,local_628.refcount._0_4_);
  if (piVar60 != (int *)0x0) {
    LOCK();
    *piVar60 = *piVar60 + -1;
    UNLOCK();
    if (*piVar60 == 0) {
      if (local_628.allocator == (Allocator *)0x0) {
        free(local_628.data);
      }
      else {
        (*(local_628.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_001ccc42:
  piVar60 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
  if (piVar60 != (int *)0x0) {
    LOCK();
    *piVar60 = *piVar60 + -1;
    UNLOCK();
    if (*piVar60 == 0) {
      if (local_698.allocator == (Allocator *)0x0) {
        free(local_698.data);
      }
      else {
        (*(local_698.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_148.refcount != (int *)0x0) {
    LOCK();
    *local_148.refcount = *local_148.refcount + -1;
    UNLOCK();
    if (*local_148.refcount == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        free(local_148.data);
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar67;
}

Assistant:

int Convolution_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 1 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv7x7s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 8 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, opt);
            // conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}